

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  stbtt_uint8 sVar8;
  byte bVar9;
  byte bVar10;
  ImWchar IVar11;
  int iVar12;
  stbtt_uint8 *data;
  long lVar13;
  undefined8 *puVar14;
  ImFontConfig *pIVar15;
  ImFont *this;
  char cVar16;
  char cVar24;
  short sVar32;
  stbrp_node *psVar33;
  undefined1 auVar34 [16];
  stbtt__buf fontdict;
  undefined1 auVar35 [16];
  undefined1 auVar36 [14];
  undefined1 auVar37 [16];
  ushort uVar38;
  short sVar39;
  stbtt_uint32 sVar40;
  uint uVar46;
  int iVar47;
  stbtt__active_edge *z;
  void *pvVar48;
  long lVar49;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  long lVar50;
  undefined4 extraout_var;
  int *piVar51;
  void *pvVar52;
  stbrp_context *ptr;
  uchar *puVar53;
  stbtt__point *points;
  stbtt__edge *psVar54;
  stbtt__buf *scanline;
  stbtt__buf *psVar55;
  stbtt__active_edge *psVar56;
  undefined8 *puVar57;
  int iVar58;
  ulong uVar59;
  ImWchar *pIVar60;
  uint *puVar61;
  long lVar62;
  stbtt__active_edge *psVar63;
  stbtt__active_edge *psVar64;
  long *plVar65;
  ulong uVar66;
  uint uVar67;
  stbtt_fontinfo *psVar68;
  ImFontAtlas *pIVar69;
  byte *pbVar70;
  ImFontAtlas *atlas_00;
  ImU32 mask;
  uchar uVar71;
  long lVar72;
  ulong uVar73;
  size_t size;
  byte *pbVar74;
  ulong uVar75;
  int iVar76;
  int iVar77;
  stbtt__edge *psVar78;
  uint uVar79;
  void *p;
  ushort *puVar80;
  stbtt__active_edge *psVar81;
  uint uVar82;
  int iVar83;
  ImFontConfig *pIVar84;
  bool bVar85;
  bool bVar86;
  short sVar90;
  short sVar91;
  undefined1 auVar87 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 in_XMM3 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar108;
  float fVar109;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar113;
  uint uVar114;
  float fVar115;
  uint uVar116;
  float fVar117;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar118;
  undefined4 uVar119;
  uint uVar127;
  uint uVar129;
  undefined1 auVar124 [16];
  float fVar128;
  float fVar130;
  uint uVar131;
  float fVar132;
  undefined1 auVar125 [16];
  float fVar133;
  uint uVar138;
  uint uVar140;
  undefined1 auVar134 [16];
  float fVar139;
  float fVar141;
  uint uVar142;
  float fVar143;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined4 uVar144;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  stbtt__buf sVar160;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  int y1;
  float y0_2;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  float y_scale_inv;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 uVar161;
  byte bVar162;
  void *pvStack_4b0;
  undefined1 in_stack_fffffffffffffb58 [12];
  uint in_stack_fffffffffffffb64;
  undefined1 local_490 [12];
  float fStack_484;
  undefined8 uStack_480;
  int local_470;
  int local_46c;
  long local_468;
  void *local_460;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined8 local_438;
  void *pvStack_430;
  uint local_41c;
  undefined1 local_418 [16];
  ulong local_400;
  undefined8 local_3f8;
  void *pvStack_3f0;
  stbrp_node *local_3e8;
  ulong local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  float local_3cc;
  undefined1 local_3c8 [16];
  undefined8 *local_3b8;
  ulong local_3b0;
  float local_3a4;
  float local_3a0;
  int local_39c;
  float local_398;
  int local_394;
  int local_390;
  int local_38c;
  ulong local_388;
  uchar *local_380;
  long local_378;
  stbtt__point *local_370;
  uchar *local_368;
  ulong local_360;
  ulong local_358;
  float *local_350;
  float local_344;
  float local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  int local_330;
  float local_32c;
  float local_328;
  int local_324;
  stbrp_context *local_320;
  long local_318;
  stbtt_fontinfo *local_310;
  ulong local_308;
  float *local_300;
  float local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  stbtt__edge *local_2d0;
  ImFontConfig *local_2c8;
  long local_2c0;
  undefined2 *local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  long local_298;
  size_t local_290;
  size_t local_288;
  int local_280;
  int local_27c;
  undefined1 local_278 [16];
  stbtt__buf local_268 [33];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined6 uVar120;
  undefined8 uVar121;
  undefined1 auVar122 [12];
  undefined1 auVar123 [14];
  undefined1 auVar126 [16];
  undefined6 uVar145;
  undefined8 uVar146;
  undefined1 auVar147 [12];
  undefined1 auVar148 [14];
  undefined1 auVar153 [16];
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  pvStack_4b0 = (void *)0x0;
  local_438 = 0;
  pvStack_430 = (void *)0x0;
  iVar12 = (atlas->ConfigData).Size;
  if (0 < iVar12) {
    iVar83 = 8;
    if (7 < iVar12) {
      iVar83 = iVar12;
    }
    if (0 < iVar83) {
      pvStack_4b0 = ImGui::MemAlloc((long)iVar83 * 0x110);
    }
  }
  uVar46 = (atlas->Fonts).Size;
  if (local_438._4_4_ < (int)uVar46) {
    if (local_438._4_4_ == 0) {
      uVar82 = 8;
    }
    else {
      uVar82 = local_438._4_4_ / 2 + local_438._4_4_;
    }
    if ((int)uVar82 <= (int)uVar46) {
      uVar82 = uVar46;
    }
    if (local_438._4_4_ < (int)uVar82) {
      pvVar48 = ImGui::MemAlloc((long)(int)uVar82 << 5);
      if (pvStack_430 != (void *)0x0) {
        memcpy(pvVar48,pvStack_430,(long)(int)local_438 << 5);
        ImGui::MemFree(pvStack_430);
      }
      local_438 = (ulong)uVar82 << 0x20;
      pvStack_430 = pvVar48;
    }
  }
  local_438 = CONCAT44(local_438._4_4_,uVar46);
  pIVar69 = atlas;
  memset(pvStack_4b0,0,(long)iVar12 * 0x110);
  memset(pvStack_430,0,(long)(int)local_438 << 5);
  iVar83 = (atlas->ConfigData).Size;
  uVar161 = CONCAT13(iVar83 < 1,(int3)in_stack_fffffffffffffb34);
  if (0 < iVar83) {
    lVar72 = 0;
    do {
      pIVar84 = (atlas->ConfigData).Data + lVar72;
      lVar49 = lVar72 * 0x110;
      *(undefined4 *)((long)pvStack_4b0 + lVar49 + 0xe0) = 0xffffffff;
      if ((atlas->Fonts).Size < 1) goto LAB_0020ca7b;
      lVar50 = 0;
      do {
        if (pIVar84->DstFont == (atlas->Fonts).Data[lVar50]) {
          *(int *)((long)pvStack_4b0 + lVar49 + 0xe0) = (int)lVar50;
        }
        lVar50 = lVar50 + 1;
        iVar83 = *(int *)((long)pvStack_4b0 + lVar49 + 0xe0);
      } while ((lVar50 < (atlas->Fonts).Size) && (iVar83 == -1));
      if (iVar83 == -1) goto LAB_0020ca7b;
      data = (stbtt_uint8 *)pIVar84->FontData;
      iVar83 = pIVar84->FontNo;
      sVar8 = *data;
      local_3c8._0_8_ = lVar72;
      if (((((sVar8 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar8 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_00209982:
        sVar45 = -(uint)(iVar83 != 0);
      }
      else {
        if (sVar8 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0020995a;
          goto LAB_00209982;
        }
        if ((((sVar8 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_00209982;
LAB_0020995a:
        sVar45 = 0xffffffff;
        if (sVar8 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar46 = *(uint *)(data + 4);
              uVar46 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8 |
                       uVar46 << 0x18;
              if (((uVar46 == 0x20000) || (uVar46 == 0x10000)) &&
                 (uVar46 = *(uint *)(data + 8),
                 iVar83 < (int)(uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8 |
                               uVar46 << 0x18))) {
                uVar46 = *(uint *)(data + (long)iVar83 * 4 + 0xc);
                sVar45 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8 |
                         uVar46 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_00209982;
        }
      }
      *(stbtt_uint8 **)((long)pvStack_4b0 + lVar49 + 8) = data;
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x10) = sVar45;
      *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x40) = 0;
      *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x48) = 0;
      sVar40 = stbtt__find_table(data,sVar45,"cmap");
      auVar92 = local_448;
      local_448._4_4_ = extraout_var;
      local_448._0_4_ = sVar40;
      local_448._8_8_ = auVar92._8_8_;
      sVar40 = stbtt__find_table(data,sVar45,"loca");
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x18) = sVar40;
      sVar41 = stbtt__find_table(data,sVar45,"head");
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x1c) = sVar41;
      sVar42 = stbtt__find_table(data,sVar45,"glyf");
      local_418._0_4_ = sVar42;
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x20) = sVar42;
      sVar42 = stbtt__find_table(data,sVar45,"hhea");
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x24) = sVar42;
      sVar43 = stbtt__find_table(data,sVar45,"hmtx");
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x28) = sVar43;
      sVar44 = stbtt__find_table(data,sVar45,"kern");
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x2c) = sVar44;
      local_490._8_4_ = sVar45;
      sVar45 = stbtt__find_table(data,sVar45,"GPOS");
      *(stbtt_uint32 *)((long)pvStack_4b0 + lVar49 + 0x30) = sVar45;
      uVar121 = local_448._0_8_;
      iVar83 = local_448._0_4_;
      if ((((iVar83 == 0) || (sVar41 == 0)) || (sVar42 == 0)) || (sVar43 == 0)) goto LAB_0020ca7b;
      if (local_418._0_4_ == 0) {
        local_3f8 = CONCAT44(local_3f8._4_4_,2);
        local_490._0_8_ = local_490._0_8_ & 0xffffffff00000000;
        local_3d8._0_4_ = 0;
        uVar46 = 0;
        sVar45 = stbtt__find_table(data,local_490._8_4_,"CFF ");
        if (sVar45 == 0) goto LAB_0020ca7b;
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x90) = 0;
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x98) = 0;
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x80) = 0;
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvStack_4b0 + lVar49 + 0x40) = data + sVar45;
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x48) = 0x2000000000000000;
        local_268[0].data = *(uchar **)((long)pvStack_4b0 + lVar49 + 0x40);
        uVar146 = *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0x48);
        local_268[0].cursor = (int)uVar146;
        local_268[0].size = (int)((ulong)uVar146 >> 0x20);
        uVar82 = local_268[0].cursor + 2U;
        if (local_268[0].size < (int)(local_268[0].cursor + 2U)) {
          uVar82 = local_268[0].size;
        }
        if (local_268[0].cursor < -2) {
          uVar82 = local_268[0].size;
        }
        local_268[0].cursor = 0;
        if ((int)uVar82 < local_268[0].size) {
          local_268[0].cursor = (int)local_268[0].data[(int)uVar82];
        }
        if (local_268[0].size < local_268[0].cursor) {
          local_268[0].cursor = local_268[0].size;
        }
        stbtt__cff_get_index(local_268);
        sVar160 = stbtt__cff_get_index(local_268);
        local_458 = (undefined1  [16])stbtt__cff_index_get(sVar160,0);
        stbtt__cff_get_index(local_268);
        sVar160 = stbtt__cff_get_index(local_268);
        *(stbtt__buf *)((long)pvStack_4b0 + lVar49 + 0x60) = sVar160;
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x11,1,(stbtt_uint32 *)local_490);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x106,1,(stbtt_uint32 *)&local_3f8);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x124,1,(stbtt_uint32 *)&local_3d8);
        stbtt__dict_get_ints
                  ((stbtt__buf *)local_458,0x125,1,(stbtt_uint32 *)&stack0xfffffffffffffb64);
        sVar160.data._4_4_ = uVar161;
        sVar160.data._0_4_ = sVar40;
        sVar160._8_8_ = pIVar69;
        fontdict.size = uVar46;
        fontdict.data = (uchar *)in_stack_fffffffffffffb58._0_8_;
        fontdict.cursor = in_stack_fffffffffffffb58._8_4_;
        sVar160 = stbtt__get_subrs(sVar160,fontdict);
        *(stbtt__buf *)((long)pvStack_4b0 + lVar49 + 0x70) = sVar160;
        if (((stbtt_uint32)local_3f8 != 2) || (uVar119 = local_490._0_4_, local_490._0_4_ == 0))
        goto LAB_0020ca7b;
        in_stack_fffffffffffffb64 = uVar46;
        if ((stbtt_uint32)local_3d8 != 0) {
          if ((ulong)uVar46 == 0) goto LAB_0020ca7b;
          local_268[0].cursor = (stbtt_uint32)local_3d8;
          if (local_268[0].size < (int)(stbtt_uint32)local_3d8) {
            local_268[0].cursor = local_268[0].size;
          }
          if ((int)(stbtt_uint32)local_3d8 < 0) {
            local_268[0].cursor = local_268[0].size;
          }
          sVar160 = stbtt__cff_get_index(local_268);
          *(stbtt__buf *)((long)pvStack_4b0 + lVar49 + 0x80) = sVar160;
          puVar53 = local_268[0].data + uVar46;
          lVar72 = (ulong)(local_268[0].size - uVar46) << 0x20;
          if ((int)(local_268[0].size - uVar46 | uVar46) < 0 || local_268[0].size < (int)uVar46) {
            puVar53 = (uchar *)0x0;
            lVar72 = 0;
          }
          *(uchar **)((long)pvStack_4b0 + lVar49 + 0x90) = puVar53;
          *(long *)((long)pvStack_4b0 + lVar49 + 0x98) = lVar72;
        }
        local_268[0].cursor = uVar119;
        if (local_268[0].size < (int)uVar119) {
          local_268[0].cursor = local_268[0].size;
        }
        if ((int)uVar119 < 0) {
          local_268[0].cursor = local_268[0].size;
        }
        sVar160 = stbtt__cff_get_index(local_268);
        *(stbtt__buf *)((long)pvStack_4b0 + lVar49 + 0x50) = sVar160;
        atlas = pIVar69;
      }
      else {
        atlas = pIVar69;
        if (sVar40 == 0) goto LAB_0020ca7b;
      }
      sVar45 = stbtt__find_table(data,local_490._8_4_,"maxp");
      if (sVar45 == 0) {
        uVar46 = 0xffff;
      }
      else {
        uVar46 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar45 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar45 + 4) >> 8);
      }
      *(uint *)((long)pvStack_4b0 + lVar49 + 0x14) = uVar46;
      *(undefined4 *)((long)pvStack_4b0 + lVar49 + 0x34) = 0xffffffff;
      uVar38 = *(ushort *)(data + (uVar121 & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (uVar121 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvStack_4b0 + lVar49 + 0x38) = 0;
      if (uVar38 != 0) {
        uVar46 = iVar83 + 4;
        uVar59 = (ulong)uVar38;
        do {
          uVar38 = *(ushort *)(data + uVar46) << 8 | *(ushort *)(data + uVar46) >> 8;
          if ((uVar38 == 0) ||
             ((uVar38 == 3 &&
              ((uVar38 = *(ushort *)(data + (ulong)uVar46 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar46 + 2) >> 8, uVar38 == 10 || (uVar38 == 1)))
              ))) {
            uVar82 = *(uint *)(data + (ulong)uVar46 + 4);
            *(uint *)((long)pvStack_4b0 + lVar49 + 0x38) =
                 (uVar82 >> 0x18 | (uVar82 & 0xff0000) >> 8 | (uVar82 & 0xff00) << 8 |
                 uVar82 << 0x18) + iVar83;
          }
          uVar46 = uVar46 + 8;
          uVar59 = uVar59 - 1;
        } while (uVar59 != 0);
      }
      if (*(int *)((long)pvStack_4b0 + lVar49 + 0x38) == 0) goto LAB_0020ca7b;
      *(uint *)((long)pvStack_4b0 + lVar49 + 0x3c) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)pvStack_4b0 + lVar49 + 0x1c) + 0x32) << 8 |
                         *(ushort *)
                          (data + (long)*(int *)((long)pvStack_4b0 + lVar49 + 0x1c) + 0x32) >> 8);
      piVar51 = (int *)((long)*(int *)((long)pvStack_4b0 + lVar49 + 0xe0) * 0x20 + (long)pvStack_430
                       );
      pIVar60 = pIVar84->GlyphRanges;
      if (pIVar60 == (ImWchar *)0x0) {
        pIVar60 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvStack_4b0 + lVar49 + 0xd8) = pIVar60;
      IVar11 = *pIVar60;
      while (IVar11 != 0) {
        uVar38 = pIVar60[1];
        if (uVar38 == 0) break;
        uVar46 = *(uint *)((long)pvStack_4b0 + lVar49 + 0xe4);
        uVar82 = (uint)uVar38;
        if ((int)(uint)uVar38 < (int)uVar46) {
          uVar82 = uVar46;
        }
        *(uint *)((long)pvStack_4b0 + lVar49 + 0xe4) = uVar82;
        IVar11 = pIVar60[2];
        pIVar60 = pIVar60 + 2;
      }
      *piVar51 = *piVar51 + 1;
      iVar83 = *(int *)((long)pvStack_4b0 + lVar49 + 0xe4);
      if (iVar83 < piVar51[1]) {
        iVar83 = piVar51[1];
      }
      piVar51[1] = iVar83;
      lVar72 = local_3c8._0_8_ + 1;
      lVar49 = (long)(atlas->ConfigData).Size;
      uVar161 = CONCAT13(lVar49 <= lVar72,(int3)uVar161);
      pIVar69 = atlas;
    } while (lVar72 < lVar49);
  }
  uVar59 = uStack_480;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uStack_480;
  stack0xfffffffffffffb78 = auVar92 << 0x40;
  if (0 < iVar12) {
    lVar72 = 0;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar59;
    stack0xfffffffffffffb78 = auVar124 << 0x40;
    do {
      pvVar48 = pvStack_430;
      local_448._0_8_ = lVar72;
      lVar72 = lVar72 * 0x110;
      iVar83 = *(int *)((long)pvStack_4b0 + lVar72 + 0xe0);
      ImBitVector::Create((ImBitVector *)((long)pvStack_4b0 + lVar72 + 0xf0),
                          *(int *)((long)pvStack_4b0 + lVar72 + 0xe4) + 1);
      if (*(int *)((long)pvVar48 + (long)iVar83 * 0x20 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar48 + (long)iVar83 * 0x20 + 0x10),
                            *(int *)((long)pvVar48 + (long)iVar83 * 0x20 + 4) + 1);
      }
      psVar68 = (stbtt_fontinfo *)((long)pvStack_4b0 + lVar72);
      puVar80 = *(ushort **)&psVar68[1].index_map;
      uVar38 = *puVar80;
      for (; (uVar38 != 0 && (puVar80[1] != 0)); puVar80 = puVar80 + 2) {
        if (uVar38 <= puVar80[1]) {
          uVar59 = (ulong)uVar38;
          do {
            uVar82 = (uint)uVar59;
            uVar46 = 1 << ((byte)uVar59 & 0x1f);
            if (((*(uint *)(*(long *)((long)pvVar48 + (long)iVar83 * 0x20 + 0x18) +
                           (uVar59 >> 5) * 4) >> (uVar82 & 0x1f) & 1) == 0) &&
               (iVar47 = stbtt_FindGlyphIndex(psVar68,uVar82), auVar92 = stack0xfffffffffffffb78,
               iVar47 != 0)) {
              piVar51 = &psVar68[1].cff.cursor;
              *piVar51 = *piVar51 + 1;
              piVar51 = (int *)((long)pvVar48 + (long)iVar83 * 0x20 + 8);
              *piVar51 = *piVar51 + 1;
              uVar59 = (ulong)(uint)((int)(uVar59 >> 5) << 2);
              puVar1 = (uint *)(*(long *)&psVar68[1].charstrings.cursor + uVar59);
              *puVar1 = *puVar1 | uVar46;
              puVar1 = (uint *)(*(long *)((long)pvVar48 + (long)iVar83 * 0x20 + 0x18) + uVar59);
              *puVar1 = *puVar1 | uVar46;
              iVar47 = local_490._8_4_;
              fStack_484 = 0.0;
              local_490._8_4_ = iVar47 + 1;
              uStack_480 = auVar92._8_8_;
            }
            uVar59 = (ulong)(uVar82 + 1);
          } while (uVar82 < puVar80[1]);
        }
        uVar38 = puVar80[2];
      }
      lVar72 = local_448._0_8_ + 1;
    } while (lVar72 < iVar12);
  }
  uVar46 = local_490._8_4_;
  if (0 < iVar12) {
    lVar72 = 0;
    do {
      lVar49 = lVar72 * 0x110;
      iVar83 = *(int *)((long)pvStack_4b0 + lVar49 + 0xe8);
      if (*(int *)((long)pvStack_4b0 + lVar49 + 0x104) < iVar83) {
        pvVar52 = ImGui::MemAlloc((long)iVar83 << 2);
        pvVar48 = *(void **)((long)pvStack_4b0 + lVar49 + 0x108);
        if (pvVar48 != (void *)0x0) {
          memcpy(pvVar52,pvVar48,(long)*(int *)((long)pvStack_4b0 + lVar49 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvStack_4b0 + lVar49 + 0x108));
        }
        *(void **)((long)pvStack_4b0 + lVar49 + 0x108) = pvVar52;
        *(int *)((long)pvStack_4b0 + lVar49 + 0x104) = iVar83;
      }
      local_418._0_8_ = lVar72;
      lVar72 = (long)*(int *)((long)pvStack_4b0 + lVar49 + 0xf0);
      if (0 < lVar72) {
        puVar61 = *(uint **)((long)pvStack_4b0 + lVar49 + 0xf8);
        puVar1 = puVar61 + lVar72;
        iVar83 = 0;
        do {
          local_448._0_8_ = puVar61;
          uVar46 = *puVar61;
          if (uVar46 != 0) {
            uVar82 = 0;
            do {
              if ((uVar46 >> (uVar82 & 0x1f) & 1) != 0) {
                iVar47 = *(int *)((long)pvStack_4b0 + lVar49 + 0x100);
                iVar77 = *(int *)((long)pvStack_4b0 + lVar49 + 0x104);
                if (iVar47 == iVar77) {
                  if (iVar77 == 0) {
                    iVar58 = 8;
                  }
                  else {
                    iVar58 = iVar77 / 2 + iVar77;
                  }
                  iVar47 = iVar47 + 1;
                  if (iVar47 < iVar58) {
                    iVar47 = iVar58;
                  }
                  if (iVar77 < iVar47) {
                    pvVar52 = ImGui::MemAlloc((long)iVar47 << 2);
                    pvVar48 = *(void **)((long)pvStack_4b0 + lVar49 + 0x108);
                    if (pvVar48 != (void *)0x0) {
                      memcpy(pvVar52,pvVar48,(long)*(int *)((long)pvStack_4b0 + lVar49 + 0x100) << 2
                            );
                      ImGui::MemFree(*(void **)((long)pvStack_4b0 + lVar49 + 0x108));
                    }
                    *(void **)((long)pvStack_4b0 + lVar49 + 0x108) = pvVar52;
                    *(int *)((long)pvStack_4b0 + lVar49 + 0x104) = iVar47;
                  }
                }
                *(uint *)(*(long *)((long)pvStack_4b0 + lVar49 + 0x108) +
                         (long)*(int *)((long)pvStack_4b0 + lVar49 + 0x100) * 4) = iVar83 + uVar82;
                piVar51 = (int *)((long)pvStack_4b0 + lVar49 + 0x100);
                *piVar51 = *piVar51 + 1;
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != 0x20);
          }
          puVar61 = (uint *)(local_448._0_8_ + 4);
          iVar83 = iVar83 + 0x20;
        } while (puVar61 < puVar1);
      }
      pvVar48 = *(void **)((long)pvStack_4b0 + lVar49 + 0xf8);
      uVar46 = local_490._8_4_;
      uVar121 = local_418._0_8_;
      if (pvVar48 != (void *)0x0) {
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0xf0) = 0;
        ImGui::MemFree(pvVar48);
        *(undefined8 *)((long)pvStack_4b0 + lVar49 + 0xf8) = 0;
      }
      lVar72 = uVar121 + 1;
    } while (lVar72 < iVar12);
  }
  if (0 < (int)local_438) {
    lVar72 = 0x18;
    lVar49 = 0;
    do {
      pvVar48 = pvStack_430;
      if (*(void **)((long)pvStack_430 + lVar72) != (void *)0x0) {
        *(undefined8 *)((long)pvStack_430 + lVar72 + -8) = 0;
        ImGui::MemFree(*(void **)((long)pvStack_430 + lVar72));
        *(undefined8 *)((long)pvVar48 + lVar72) = 0;
      }
      lVar49 = lVar49 + 1;
      lVar72 = lVar72 + 0x20;
    } while (lVar49 < (int)local_438);
  }
  if (pvStack_430 != (void *)0x0) {
    local_438 = 0;
    ImGui::MemFree(pvStack_430);
    pvStack_430 = (void *)0x0;
  }
  local_458 = ZEXT816(0);
  local_3f8 = 0;
  pvStack_3f0 = (void *)0x0;
  if (0 < (int)uVar46) {
    uVar82 = 8;
    if (7 < (int)uVar46) {
      uVar82 = uVar46;
    }
    if (0 < (int)uVar82) {
      pvVar48 = ImGui::MemAlloc((long)(int)uVar82 * 0x18);
      if ((void *)local_458._8_8_ != (void *)0x0) {
        memcpy(pvVar48,(void *)local_458._8_8_,(long)(int)local_458._0_4_ * 0x18);
        ImGui::MemFree((void *)local_458._8_8_);
      }
      auVar134._4_8_ = pvVar48;
      auVar134._0_4_ = uVar82;
      auVar134._12_4_ = 0;
      local_458 = auVar134 << 0x20;
    }
  }
  local_458._0_4_ = uVar46;
  if (local_3f8._4_4_ < (int)uVar46) {
    if (local_3f8._4_4_ == 0) {
      uVar82 = 8;
    }
    else {
      uVar82 = local_3f8._4_4_ / 2 + local_3f8._4_4_;
    }
    if ((int)uVar82 <= (int)uVar46) {
      uVar82 = uVar46;
    }
    if (local_3f8._4_4_ < (int)uVar82) {
      pvVar48 = ImGui::MemAlloc((long)(int)uVar82 * 0x1c);
      if (pvStack_3f0 != (void *)0x0) {
        memcpy(pvVar48,pvStack_3f0,(long)(int)(stbtt_uint32)local_3f8 * 0x1c);
        ImGui::MemFree(pvStack_3f0);
      }
      local_3f8 = (ulong)uVar82 << 0x20;
      pvStack_3f0 = pvVar48;
    }
  }
  local_3f8 = CONCAT44(local_3f8._4_4_,uVar46);
  iVar83 = 0;
  atlas_00 = pIVar69;
  memset((void *)local_458._8_8_,0,(long)(int)local_458._0_4_ * 0x18);
  memset(pvStack_3f0,0,(long)(int)(stbtt_uint32)local_3f8 * 0x1c);
  fVar98 = 0.0;
  if (0 < iVar12) {
    lVar72 = 0;
    iVar77 = 0;
    iVar47 = 0;
    do {
      iVar58 = *(int *)((long)pvStack_4b0 + lVar72 * 0x110 + 0xe8);
      if (iVar58 != 0) {
        psVar68 = (stbtt_fontinfo *)((long)pvStack_4b0 + lVar72 * 0x110);
        *(long *)&psVar68[1].hmtx = (long)iVar77 * 0x18 + local_458._8_8_;
        pvVar48 = (void *)((long)iVar47 * 0x1c + (long)pvStack_3f0);
        *(void **)&psVar68[1].gpos = pvVar48;
        pIVar84 = (pIVar69->ConfigData).Data;
        *(float *)&psVar68[1].userdata = pIVar84[lVar72].SizePixels;
        *(undefined4 *)((long)&psVar68[1].userdata + 4) = 0;
        psVar68[1].data = *(uchar **)&psVar68[1].gsubrs.cursor;
        psVar68[1].fontstart = *(int *)&psVar68[1].gsubrs.data;
        *(void **)&psVar68[1].loca = pvVar48;
        *(char *)&psVar68[1].glyf = (char)pIVar84[lVar72].OversampleH;
        *(char *)((long)&psVar68[1].glyf + 1) = (char)pIVar84[lVar72].OversampleV;
        fVar98 = pIVar84[lVar72].SizePixels;
        fVar103 = 0.0;
        uVar119 = 0;
        uVar144 = 0;
        if (fVar98 <= 0.0) {
          fVar103 = -0.0;
          uVar119 = 0x80000000;
          uVar144 = 0x80000000;
          fVar98 = -fVar98;
          uVar46 = (uint)(ushort)(*(ushort *)(psVar68->data + (long)psVar68->head + 0x12) << 8 |
                                 *(ushort *)(psVar68->data + (long)psVar68->head + 0x12) >> 8);
        }
        else {
          puVar53 = psVar68->data;
          lVar49 = (long)psVar68->hhea;
          uVar46 = ((int)(short)((ushort)puVar53[lVar49 + 4] << 8) | (uint)puVar53[lVar49 + 5]) -
                   ((int)(short)((ushort)puVar53[lVar49 + 6] << 8) | (uint)puVar53[lVar49 + 7]);
          pIVar69 = atlas_00;
        }
        iVar77 = iVar77 + iVar58;
        iVar47 = iVar47 + iVar58;
        if (0 < *(int *)&psVar68[1].gsubrs.data) {
          local_418._0_4_ = iVar47;
          local_448._0_8_ = lVar72;
          iVar47 = pIVar69->TexGlyphPadding + -1;
          lVar50 = 0;
          lVar49 = 0;
          fStack_484 = fVar103;
          local_490._8_4_ = fVar98 / (float)(int)uVar46;
          uStack_480._0_4_ = uVar119;
          uStack_480._4_4_ = uVar144;
          pIVar69 = atlas_00;
          do {
            iVar58 = stbtt_FindGlyphIndex
                               (psVar68,*(int *)(*(long *)&psVar68[1].gsubrs.cursor + lVar49 * 4));
            fVar98 = local_490._8_4_;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar68,iVar58,(float)pIVar84[lVar72].OversampleH * fVar98,
                       (float)pIVar84[lVar72].OversampleV * fVar98,fVar98,in_XMM3._0_4_,
                       (int *)local_268,(int *)local_490,(int *)&local_3d8,
                       (int *)&stack0xfffffffffffffb64);
            *(stbtt_uint32 *)(*(long *)&psVar68[1].hmtx + 4 + lVar50) =
                 (((stbtt_uint32)local_3d8 + iVar47) - (int)local_268[0].data) +
                 pIVar84[lVar72].OversampleH;
            *(uint *)(*(long *)&psVar68[1].hmtx + 8 + lVar50) =
                 ((in_stack_fffffffffffffb64 + iVar47) - local_490._0_4_) +
                 pIVar84[lVar72].OversampleV;
            iVar83 = iVar83 + *(int *)(*(long *)&psVar68[1].hmtx + 8 + lVar50) *
                              *(int *)(*(long *)&psVar68[1].hmtx + 4 + lVar50);
            lVar49 = lVar49 + 1;
            lVar50 = lVar50 + 0x18;
          } while (lVar49 < *(int *)&psVar68[1].gsubrs.data);
          lVar72 = local_448._0_8_;
          iVar47 = local_418._0_4_;
          atlas_00 = pIVar69;
        }
      }
      lVar72 = lVar72 + 1;
    } while (lVar72 < iVar12);
    fVar98 = (float)iVar83;
  }
  if (fVar98 < 0.0) {
    fVar98 = sqrtf(fVar98);
  }
  else {
    fVar98 = SQRT(fVar98);
  }
  pIVar69->TexHeight = 0;
  local_46c = pIVar69->TexDesiredWidth;
  if (local_46c < 1) {
    iVar83 = (int)fVar98;
    local_46c = 0x1000;
    if ((iVar83 < 0xb33) && (local_46c = 0x800, iVar83 < 0x599)) {
      local_46c = (uint)(0x2cb < iVar83) * 0x200 + 0x200;
    }
  }
  pIVar69->TexWidth = local_46c;
  local_470 = pIVar69->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar83 = local_46c - local_470;
  local_3e8 = (stbrp_node *)ImGui::MemAlloc((long)iVar83 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_3e8 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_3e8 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_3e8);
    }
    local_3e8 = (stbrp_node *)0x0;
    local_470 = 0;
    local_46c = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar83 < 2) {
      uVar59 = 0;
    }
    else {
      uVar59 = 0;
      psVar33 = local_3e8;
      do {
        uVar59 = uVar59 + 1;
        psVar33->next = psVar33 + 1;
        psVar33 = psVar33 + 1;
      } while (iVar83 - 1 != uVar59);
      uVar59 = uVar59 & 0xffffffff;
    }
    local_3e8[uVar59].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_3e8;
    ptr->active_head = ptr->extra;
    ptr->width = iVar83;
    ptr->height = 0x8000 - local_470;
    ptr->num_nodes = iVar83;
    ptr->align = (iVar83 * 2 + -1) / iVar83;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = iVar83;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_320 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if (0 < iVar12) {
    lVar72 = 0;
    do {
      lVar49 = lVar72 * 0x110;
      iVar83 = *(int *)((long)pvStack_4b0 + lVar49 + 0xe8);
      if ((iVar83 != 0) &&
         (stbrp_pack_rects(local_320,*(stbrp_rect **)((long)pvStack_4b0 + lVar49 + 200),iVar83),
         0 < *(int *)((long)pvStack_4b0 + lVar49 + 0xe8))) {
        lVar50 = 0x14;
        lVar62 = 0;
        do {
          lVar13 = *(long *)((long)pvStack_4b0 + lVar49 + 200);
          if (*(int *)(lVar13 + lVar50) != 0) {
            iVar83 = *(int *)(lVar13 + -0xc + lVar50) + *(int *)(lVar13 + -4 + lVar50);
            if (iVar83 < atlas_00->TexHeight) {
              iVar83 = atlas_00->TexHeight;
            }
            atlas_00->TexHeight = iVar83;
          }
          lVar62 = lVar62 + 1;
          lVar50 = lVar50 + 0x18;
        } while (lVar62 < *(int *)((long)pvStack_4b0 + lVar49 + 0xe8));
      }
      lVar72 = lVar72 + 1;
    } while (lVar72 < iVar12);
  }
  uVar46 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar46 = (int)(uVar46 - 1) >> 1 | uVar46 - 1;
    uVar46 = (int)uVar46 >> 2 | uVar46;
    uVar46 = (int)uVar46 >> 4 | uVar46;
    uVar46 = (int)uVar46 >> 8 | uVar46;
    uVar46 = (int)uVar46 >> 0x10 | uVar46;
  }
  iVar83 = uVar46 + 1;
  atlas_00->TexHeight = iVar83;
  auVar149._0_4_ = (float)atlas_00->TexWidth;
  auVar149._4_4_ = (float)iVar83;
  auVar149._8_8_ = 0;
  auVar92 = divps(_DAT_0024bd00,auVar149);
  atlas_00->TexUvScale = auVar92._0_8_;
  puVar53 = (uchar *)ImGui::MemAlloc((long)(iVar83 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar53;
  pIVar69 = atlas_00;
  memset(puVar53,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < iVar12) {
    local_380 = atlas_00->TexPixelsAlpha8;
    local_468 = (long)local_46c;
    local_58 = CONCAT44(local_470,local_470);
    uStack_50 = 0;
    lVar72 = 0;
    do {
      local_318 = lVar72;
      if (*(int *)((long)pvStack_4b0 + lVar72 * 0x110 + 0xe8) != 0) {
        psVar68 = (stbtt_fontinfo *)((long)pvStack_4b0 + lVar72 * 0x110);
        local_2f8 = *(float *)&psVar68[1].userdata;
        if (local_2f8 <= 0.0) {
          uStack_2f4 = 0x80000000;
          uStack_2f0 = 0x80000000;
          uStack_2ec = 0x80000000;
          local_2f8 = -local_2f8;
          uVar46 = (uint)(ushort)(*(ushort *)(psVar68->data + (long)psVar68->head + 0x12) << 8 |
                                 *(ushort *)(psVar68->data + (long)psVar68->head + 0x12) >> 8);
        }
        else {
          puVar53 = psVar68->data;
          lVar72 = (long)psVar68->hhea;
          uVar46 = ((int)(short)((ushort)puVar53[lVar72 + 4] << 8) | (uint)puVar53[lVar72 + 5]) -
                   ((int)(short)((ushort)puVar53[lVar72 + 6] << 8) | (uint)puVar53[lVar72 + 7]);
          uStack_2f4 = 0;
          uStack_2f0 = 0;
          uStack_2ec = 0;
        }
        local_2f8 = local_2f8 / (float)(int)uVar46;
        bVar162 = (byte)psVar68[1].glyf;
        fVar98 = (float)bVar162;
        local_3a0 = 0.0;
        local_3a4 = 0.0;
        if (bVar162 != 0) {
          local_3a4 = (float)(int)(1 - (uint)bVar162) / (fVar98 + fVar98);
        }
        bVar9 = *(byte *)((long)&psVar68[1].glyf + 1);
        fVar103 = (float)bVar9;
        if (bVar9 != 0) {
          local_3a0 = (float)(int)(1 - (uint)bVar9) / (fVar103 + fVar103);
        }
        local_2c8 = (atlas_00->ConfigData).Data;
        if (0 < psVar68[1].fontstart) {
          lVar72._0_4_ = psVar68[1].hmtx;
          lVar72._4_4_ = psVar68[1].kern;
          local_340 = 1.0 / fVar98;
          local_344 = 1.0 / fVar103;
          local_3d0 = fVar98 * local_2f8;
          fVar99 = fVar103 * local_2f8;
          fVar98 = fVar99;
          if (local_3d0 <= fVar99) {
            fVar98 = local_3d0;
          }
          local_398 = (0.35 / fVar98) * (0.35 / fVar98);
          local_278 = ZEXT416((uint)fVar99);
          auVar100._0_4_ = -fVar99;
          auVar100._4_4_ = 0x80000000;
          auVar100._8_4_ = 0x80000000;
          auVar100._12_4_ = 0x80000000;
          local_48 = auVar100;
          local_2a0 = (ulong)(uint)bVar162;
          uVar75 = 0xffffffff;
          uVar59 = 0;
          local_2c0 = lVar72;
          local_310 = psVar68;
          local_3e0 = (ulong)bVar162;
          local_400 = (ulong)bVar9;
          local_2a8 = (ulong)(uint)bVar9;
          uVar46 = in_stack_fffffffffffffb64;
          do {
            fVar98 = auVar100._0_4_;
            iVar83 = *(int *)(lVar72 + 0x14 + uVar59 * 0x18);
            in_stack_fffffffffffffb64 = uVar46;
            if (iVar83 != 0) {
              lVar49 = lVar72 + uVar59 * 0x18;
              iVar47 = *(int *)(lVar49 + 4);
              if ((iVar47 == 0) || (iVar77 = *(int *)(lVar49 + 8), iVar77 == 0)) {
                atlas_00 = pIVar69;
                if ((iVar83 != 0) &&
                   (((*(int *)(lVar49 + 4) == 0 && (*(int *)(lVar49 + 8) == 0)) &&
                    (-1 < (int)(uint)uVar75)))) {
                  lVar49 = *(long *)&psVar68[1].loca;
                  auVar92 = *(undefined1 (*) [16])(lVar49 + uVar75 * 0x1c);
                  *(undefined1 (*) [16])(lVar49 + 0xc + uVar59 * 0x1c) =
                       *(undefined1 (*) [16])(lVar49 + 0xc + uVar75 * 0x1c);
                  *(undefined1 (*) [16])(lVar49 + uVar59 * 0x1c) = auVar92;
                }
              }
              else {
                if (psVar68[1].data == (uchar *)0x0) {
                  iVar83 = *(int *)((long)&psVar68[1].userdata + 4) + (int)uVar59;
                }
                else {
                  iVar83 = *(int *)(psVar68[1].data + uVar59 * 4);
                }
                local_2b8 = (undefined2 *)(uVar59 * 0x1c + *(long *)&psVar68[1].loca);
                local_334 = (uint)uVar75;
                local_2b0 = uVar59;
                uVar82 = stbtt_FindGlyphIndex(psVar68,iVar83);
                *(ulong *)(lVar49 + 0xc) =
                     CONCAT44((int)((ulong)*(undefined8 *)(lVar49 + 0xc) >> 0x20) + local_58._4_4_,
                              (int)*(undefined8 *)(lVar49 + 0xc) + (int)local_58);
                *(int *)(lVar49 + 4) = iVar47 - local_470;
                *(int *)(lVar49 + 8) = iVar77 - local_470;
                puVar53 = psVar68->data;
                uVar38 = *(ushort *)(puVar53 + (long)psVar68->hhea + 0x22) << 8 |
                         *(ushort *)(puVar53 + (long)psVar68->hhea + 0x22) >> 8;
                iVar83 = psVar68->hmtx;
                lVar72 = (ulong)uVar38 * 4 + (long)iVar83 + -4;
                lVar50 = (ulong)uVar38 * 4 + (long)iVar83 + -3;
                if ((int)uVar82 < (int)(uint)uVar38) {
                  lVar72 = (long)(int)(uVar82 * 4) + (long)iVar83;
                  lVar50 = (long)(int)(uVar82 * 4) + 1 + (long)iVar83;
                }
                local_338 = (uint)puVar53[lVar72];
                local_33c = (uint)puVar53[lVar50];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar68,uVar82,local_3d0,(float)local_278._0_4_,fVar98,fVar103,&local_38c
                           ,&local_390,&local_27c,&local_280);
                local_418._0_8_ = (long)*(int *)(lVar49 + 0xc);
                local_368 = (uchar *)(long)*(int *)(lVar49 + 0x10);
                local_3b0 = (ulong)*(uint *)(lVar49 + 4);
                local_388 = (ulong)*(uint *)(lVar49 + 8);
                local_378 = lVar49;
                local_308 = (ulong)uVar82;
                uVar82 = stbtt_GetGlyphShape(psVar68,uVar82,(stbtt_vertex **)&local_3d8);
                uVar67 = ((int)local_3b0 - (int)local_3e0) + 1;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_310,(int)local_308,local_3d0,(float)local_278._0_4_,fVar98,fVar103,
                           (int *)&stack0xfffffffffffffb64,&local_324,(int *)0x0,(int *)0x0);
                in_stack_fffffffffffffb64 = uVar46;
                local_41c = uVar67;
                if (uVar67 != 0) {
                  iVar83 = ((int)local_388 - (int)local_400) + 1;
                  local_3c8._0_4_ = iVar83;
                  if (iVar83 != 0) {
                    lVar72 = CONCAT44(local_3d8._4_4_,(stbtt_uint32)local_3d8);
                    local_268[0].data = (uchar *)((ulong)local_268[0].data & 0xffffffff00000000);
                    if ((int)uVar82 < 1) {
                      uVar67 = 0;
                    }
                    else {
                      lVar49 = 0;
                      uVar67 = 0;
                      do {
                        uVar67 = uVar67 + (*(char *)(lVar72 + 0xc + lVar49) == '\x01');
                        lVar49 = lVar49 + 0xe;
                      } while ((ulong)uVar82 * 0xe != lVar49);
                    }
                    local_39c = local_324;
                    if (uVar67 == 0) {
LAB_0020b0b2:
                      local_460 = (void *)0x0;
LAB_0020b0bb:
                      points = (stbtt__point *)0x0;
                    }
                    else {
                      local_460 = ImGui::MemAlloc((long)(int)uVar67 << 2);
                      if (local_460 == (void *)0x0) {
                        uVar67 = 0;
                        goto LAB_0020b0bb;
                      }
                      lVar49 = (ulong)uVar82 * 0xe;
                      uVar59 = 0;
                      iVar83 = 0;
                      points = (stbtt__point *)0x0;
                      stack0xfffffffffffffb78 = lVar49;
                      do {
                        if ((int)uVar59 == 0) {
LAB_0020ae80:
                          local_268[0].data =
                               (uchar *)((ulong)local_268[0].data & 0xffffffff00000000);
                          if ((int)uVar82 < 1) {
                            lVar50 = -1;
                          }
                          else {
                            local_448._0_8_ = uVar59;
                            fVar98 = 0.0;
                            fVar103 = 0.0;
                            uVar79 = 0xffffffff;
                            lVar50 = 0;
                            do {
                              puVar53 = local_268[0].data;
                              switch(*(undefined1 *)(lVar72 + 0xc + lVar50)) {
                              case 1:
                                if (-1 < (int)uVar79) {
                                  *(int *)((long)local_460 + (ulong)uVar79 * 4) =
                                       (int)local_268[0].data - iVar83;
                                }
                                uVar79 = uVar79 + 1;
                                auVar92 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar50)),
                                                  ZEXT416(*(uint *)(lVar72 + lVar50)),0x60);
                                iVar47 = auVar92._0_4_;
                                iVar77 = auVar92._4_4_;
                                iVar83 = (int)local_268[0].data;
                                break;
                              case 2:
                                auVar92 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar50)),
                                                  ZEXT416(*(uint *)(lVar72 + lVar50)),0x60);
                                iVar47 = auVar92._0_4_;
                                iVar77 = auVar92._4_4_;
                                break;
                              case 3:
                                stbtt__tesselate_curve
                                          (points,(int *)local_268,fVar98,fVar103,
                                           (float)(int)*(short *)(lVar72 + 4 + lVar50),
                                           (float)(int)*(short *)(lVar72 + 6 + lVar50),
                                           (float)(int)*(short *)(lVar72 + lVar50),
                                           (float)(int)*(short *)(lVar72 + 2 + lVar50),local_398,0);
                                goto LAB_0020aff0;
                              case 4:
                                stbtt__tesselate_cubic
                                          (points,(int *)local_268,fVar98,fVar103,
                                           (float)(int)*(short *)(lVar72 + 4 + lVar50),
                                           (float)(int)*(short *)(lVar72 + 6 + lVar50),
                                           (float)(int)*(short *)(lVar72 + 8 + lVar50),
                                           (float)(int)*(short *)(lVar72 + 10 + lVar50),
                                           (float)(int)*(short *)(lVar72 + lVar50),
                                           (float)(int)*(short *)(lVar72 + 2 + lVar50),local_398,0);
LAB_0020aff0:
                                auVar92 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar50)),
                                                  ZEXT416(*(uint *)(lVar72 + lVar50)),0x60);
                                fVar98 = (float)(auVar92._0_4_ >> 0x10);
                                fVar103 = (float)(auVar92._4_4_ >> 0x10);
                                lVar49 = stack0xfffffffffffffb78;
                                puVar53 = local_268[0].data;
                              default:
                                goto switchD_0020aec7_default;
                              }
                              puVar53 = (uchar *)CONCAT44(local_268[0].data._4_4_,
                                                          (int)local_268[0].data + 1);
                              fVar103 = (float)(iVar77 >> 0x10);
                              fVar98 = (float)(iVar47 >> 0x10);
                              if (points != (stbtt__point *)0x0) {
                                points[(int)local_268[0].data].x = fVar98;
                                points[(int)local_268[0].data].y = fVar103;
                              }
switchD_0020aec7_default:
                              local_268[0].data = puVar53;
                              lVar50 = lVar50 + 0xe;
                            } while (lVar49 != lVar50);
                            lVar50 = (long)(int)uVar79;
                            uVar59 = local_448._0_8_;
                          }
                          *(int *)((long)local_460 + lVar50 * 4) = (int)local_268[0].data - iVar83;
                          bVar85 = true;
                        }
                        else {
                          points = (stbtt__point *)
                                   ImGui::MemAlloc((long)(int)local_268[0].data << 3);
                          if (points != (stbtt__point *)0x0) goto LAB_0020ae80;
                          points = (stbtt__point *)0x0;
                          bVar85 = false;
                        }
                        if (!bVar85) {
                          ImGui::MemFree(points);
                          ImGui::MemFree(local_460);
                          uVar67 = 0;
                          goto LAB_0020b0b2;
                        }
                        iVar47 = (int)uVar59;
                        uVar59 = (ulong)(iVar47 + 1);
                      } while (iVar47 == 0);
                    }
                    local_370 = points;
                    if (points != (stbtt__point *)0x0) {
                      if ((int)uVar67 < 1) {
                        size = 0x14;
                      }
                      else {
                        uVar59 = 0;
                        lVar72 = 0;
                        do {
                          lVar72 = (long)(int)lVar72 + (long)*(int *)((long)local_460 + uVar59 * 4);
                          uVar59 = uVar59 + 1;
                        } while (uVar67 != uVar59);
                        size = lVar72 * 0x14 + 0x14;
                      }
                      psVar54 = (stbtt__edge *)ImGui::MemAlloc(size);
                      if (psVar54 != (stbtt__edge *)0x0) {
                        if ((int)uVar67 < 1) {
                          uVar82 = 0;
                        }
                        else {
                          uVar59 = 0;
                          uVar82 = 0;
                          iVar83 = 0;
                          do {
                            iVar47 = *(int *)((long)local_460 + uVar59 * 4);
                            if (0 < iVar47) {
                              uVar73 = (ulong)(iVar47 - 1);
                              uVar75 = 0;
                              do {
                                iVar77 = (int)uVar73;
                                if ((local_370[(long)iVar83 + (long)iVar77].y !=
                                     local_370[(long)iVar83 + uVar75].y) ||
                                   (NAN(local_370[(long)iVar83 + (long)iVar77].y) ||
                                    NAN(local_370[(long)iVar83 + uVar75].y))) {
                                  psVar78 = psVar54 + (int)uVar82;
                                  psVar54[(int)uVar82].invert = 0;
                                  iVar58 = (int)uVar75;
                                  if (local_370[(long)iVar83 + uVar75].y <=
                                      local_370[(long)iVar83 + (long)iVar77].y &&
                                      local_370[(long)iVar83 + (long)iVar77].y !=
                                      local_370[(long)iVar83 + uVar75].y) {
                                    psVar78->invert = 1;
                                    iVar58 = iVar77;
                                    iVar77 = (int)uVar75;
                                  }
                                  psVar78->x0 = local_370[(long)iVar83 + (long)iVar58].x * local_3d0
                                                + 0.0;
                                  psVar78->y0 = local_370[(long)iVar83 + (long)iVar58].y *
                                                local_48._0_4_ + 0.0;
                                  psVar78->x1 = local_370[(long)iVar83 + (long)iVar77].x * local_3d0
                                                + 0.0;
                                  psVar78->y1 = local_370[(long)iVar83 + (long)iVar77].y *
                                                local_48._0_4_ + 0.0;
                                  uVar82 = uVar82 + 1;
                                }
                                uVar73 = uVar75 & 0xffffffff;
                                uVar75 = uVar75 + 1;
                              } while ((long)uVar75 < (long)*(int *)((long)local_460 + uVar59 * 4));
                            }
                            iVar83 = iVar83 + iVar47;
                            uVar59 = uVar59 + 1;
                          } while (uVar59 != uVar67);
                        }
                        stbtt__sort_edges_quicksort(psVar54,uVar82);
                        iVar83 = (int)local_400;
                        if (1 < (int)uVar82) {
                          uVar59 = 1;
                          do {
                            uVar2 = psVar54[uVar59].x0;
                            uVar5 = psVar54[uVar59].y0;
                            iVar47 = psVar54[uVar59].invert;
                            local_268[0].cursor = iVar47;
                            local_268[0].data = *(uchar **)&psVar54[uVar59].x1;
                            uVar75 = uVar59 & 0xffffffff;
                            do {
                              uVar67 = (uint)uVar75;
                              if ((int)uVar67 < 1) break;
                              fVar98 = psVar54[uVar75 - 1].y0;
                              if ((float)uVar5 < fVar98) {
                                psVar78 = psVar54 + uVar75;
                                psVar78->invert = psVar78[-1].invert;
                                fVar103 = psVar78[-1].y0;
                                fVar99 = psVar78[-1].x1;
                                fVar108 = psVar78[-1].y1;
                                psVar78->x0 = psVar78[-1].x0;
                                psVar78->y0 = fVar103;
                                psVar78->x1 = fVar99;
                                psVar78->y1 = fVar108;
                                uVar75 = (ulong)(uVar67 - 1);
                              }
                              uVar67 = (uint)uVar75;
                            } while ((float)uVar5 < fVar98);
                            if (uVar59 != uVar67) {
                              psVar54[(int)uVar67].x0 = (float)uVar2;
                              psVar54[(int)uVar67].y0 = (float)uVar5;
                              *(uchar **)&psVar54[(int)uVar67].x1 = local_268[0].data;
                              psVar54[(int)uVar67].invert = iVar47;
                            }
                            uVar59 = uVar59 + 1;
                          } while (uVar59 != uVar82);
                        }
                        local_490._0_8_ = (stbtt__active_edge *)0x0;
                        scanline = local_268;
                        if (0x40 < (int)local_41c) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_41c * 8 + 4);
                          iVar83 = (int)local_400;
                        }
                        uVar67 = (int)local_388 - iVar83;
                        local_388 = (ulong)uVar67;
                        psVar54[(int)uVar82].y0 = (float)(local_3c8._0_4_ + local_39c) + 1.0;
                        local_2d0 = psVar54;
                        if (uVar67 < 0x7fffffff) {
                          local_368 = local_380 + (long)local_368 * local_468 + local_418._0_8_;
                          uVar82 = (int)local_3b0 - (int)local_3e0;
                          local_3b0 = (ulong)uVar82;
                          local_298 = (long)(int)local_41c;
                          local_32c = (float)(int)uVar46;
                          local_350 = (float *)((long)&scanline->data + local_298 * 4);
                          local_300 = local_350 + 1;
                          local_288 = local_298 * 4;
                          local_3cc = (float)(int)local_41c;
                          local_290 = (long)(int)(uVar82 + 2) << 2;
                          local_360 = 0;
                          local_358 = 0;
                          local_3b8 = (undefined8 *)0x0;
                          local_394 = 0;
                          psVar81 = (stbtt__active_edge *)0x0;
                          local_330 = local_39c;
                          do {
                            fVar103 = (float)local_330;
                            fVar98 = fVar103 + 1.0;
                            memset(scanline,0,local_288);
                            memset(local_350,0,local_290);
                            if ((stbtt__active_edge *)local_490._0_8_ != (stbtt__active_edge *)0x0)
                            {
                              psVar56 = (stbtt__active_edge *)local_490._0_8_;
                              psVar63 = (stbtt__active_edge *)local_490;
                              do {
                                psVar64 = psVar56;
                                if (psVar56->ey <= fVar103) {
                                  psVar63->next = psVar56->next;
                                  psVar56->direction = 0.0;
                                  psVar56->next = psVar81;
                                  psVar64 = psVar63;
                                  psVar81 = psVar56;
                                }
                                psVar56 = psVar64->next;
                                psVar63 = psVar64;
                              } while (psVar56 != (stbtt__active_edge *)0x0);
                            }
                            fVar99 = psVar54->y0;
                            psVar56 = (stbtt__active_edge *)local_490._0_8_;
                            iVar83 = local_330;
                            fVar108 = local_2e8;
                            if (fVar99 <= fVar98) {
                              bVar85 = local_39c != 0;
                              bVar86 = (int)local_358 == 0;
                              do {
                                if ((fVar99 != psVar54->y1) || (NAN(fVar99) || NAN(psVar54->y1))) {
                                  if (psVar81 == (stbtt__active_edge *)0x0) {
                                    if (local_394 == 0) {
                                      puVar57 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar57 == (undefined8 *)0x0) {
                                        psVar56 = (stbtt__active_edge *)0x0;
                                        goto LAB_0020bc04;
                                      }
                                      *puVar57 = local_3b8;
                                      local_394 = 800;
                                      local_3b8 = puVar57;
                                    }
                                    lVar72 = (long)local_394;
                                    local_394 = local_394 + -1;
                                    psVar56 = (stbtt__active_edge *)(local_3b8 + lVar72 * 4 + -3);
                                  }
                                  else {
                                    psVar56 = psVar81;
                                    psVar81 = psVar81->next;
                                  }
LAB_0020bc04:
                                  if (psVar56 != (stbtt__active_edge *)0x0) {
                                    uVar3 = psVar54->x0;
                                    uVar6 = psVar54->y0;
                                    uVar4 = psVar54->x1;
                                    uVar7 = psVar54->y1;
                                    fVar99 = ((float)uVar4 - (float)uVar3) /
                                             ((float)uVar7 - (float)uVar6);
                                    psVar56->fdx = fVar99;
                                    psVar56->fdy = (float)(-(uint)(fVar99 != 0.0) &
                                                          (uint)(1.0 / fVar99));
                                    psVar56->fx = ((fVar103 - psVar54->y0) * fVar99 + psVar54->x0) -
                                                  local_32c;
                                    psVar56->direction =
                                         *(float *)(&DAT_0025c7f0 +
                                                   (ulong)(psVar54->invert == 0) * 4);
                                    psVar56->sy = psVar54->y0;
                                    fVar99 = psVar54->y1;
                                    psVar56->ey = fVar99;
                                    psVar56->next = (stbtt__active_edge *)0x0;
                                    if (fVar99 < fVar103 && (bVar86 && bVar85)) {
                                      psVar56->ey = fVar103;
                                    }
                                    psVar56->next = (stbtt__active_edge *)local_490._0_8_;
                                    local_490._0_8_ = psVar56;
                                  }
                                }
                                fVar99 = psVar54[1].y0;
                                psVar54 = psVar54 + 1;
                                psVar56 = (stbtt__active_edge *)local_490._0_8_;
                                iVar83 = local_330;
                                fVar108 = local_2e8;
                              } while (fVar99 <= fVar98);
                            }
                            for (; local_2e8 = fVar108, psVar56 != (stbtt__active_edge *)0x0;
                                psVar56 = psVar56->next) {
                              local_2e8 = psVar56->fx;
                              fVar99 = psVar56->fdx;
                              local_330 = iVar83;
                              if ((fVar99 != 0.0) || (NAN(fVar99))) {
                                fVar113 = fVar99 + local_2e8;
                                fVar109 = psVar56->sy;
                                fVar110 = (float)(~-(uint)(fVar103 < fVar109) & (uint)local_2e8 |
                                                 (uint)((fVar109 - fVar103) * fVar99 + local_2e8) &
                                                 -(uint)(fVar103 < fVar109));
                                if (0.0 <= fVar110) {
                                  fVar115 = psVar56->ey;
                                  fVar117 = (float)(-(uint)(fVar115 < fVar98) &
                                                    (uint)((fVar115 - fVar103) * fVar99 + local_2e8)
                                                   | ~-(uint)(fVar115 < fVar98) & (uint)fVar113);
                                  if (((0.0 <= fVar117) && (fVar110 < local_3cc)) &&
                                     (fVar117 < local_3cc)) {
                                    if (fVar109 <= fVar103) {
                                      fVar109 = fVar103;
                                    }
                                    iVar83 = (int)fVar110;
                                    if (fVar98 <= fVar115) {
                                      fVar115 = fVar98;
                                    }
                                    if (iVar83 == (int)fVar117) {
                                      fVar130 = (fVar115 - fVar109) * psVar56->direction;
                                      lVar72 = (long)iVar83;
                                      *(float *)((long)&scanline->data + lVar72 * 4) =
                                           ((((float)iVar83 + 1.0) - fVar117) +
                                           (((float)iVar83 + 1.0) - fVar110)) * 0.5 * fVar130 +
                                           *(float *)((long)&scanline->data + lVar72 * 4);
                                    }
                                    else {
                                      fVar99 = psVar56->fdy;
                                      fVar118 = fVar117;
                                      if (fVar117 < fVar110) {
                                        fVar118 = fVar103 - fVar109;
                                        fVar109 = (fVar103 - fVar115) + fVar98;
                                        fVar99 = -fVar99;
                                        local_2e8 = fVar113;
                                        fVar115 = fVar118 + fVar98;
                                        fVar118 = fVar110;
                                        fVar110 = fVar117;
                                      }
                                      uVar46 = (uint)fVar110;
                                      iVar47 = (int)fVar118;
                                      iVar83 = uVar46 + 1;
                                      fVar117 = ((float)iVar83 - local_2e8) * fVar99 + fVar103;
                                      fVar128 = (float)(int)fVar118;
                                      fVar113 = fVar98;
                                      if (fVar117 <= fVar98) {
                                        fVar113 = fVar117;
                                      }
                                      fVar130 = psVar56->direction;
                                      fVar132 = (fVar113 - fVar109) * fVar130;
                                      fVar117 = (fVar128 - local_2e8) * fVar99 + fVar103;
                                      *(float *)((long)&scanline->data + (long)(int)uVar46 * 4) =
                                           ((float)iVar83 - fVar110) * fVar132 * 0.5 +
                                           *(float *)((long)&scanline->data + (long)(int)uVar46 * 4)
                                      ;
                                      if ((fVar98 < fVar117) &&
                                         (fVar117 = fVar98, iVar47 - iVar83 != 0)) {
                                        fVar99 = (fVar98 - fVar113) / (float)(iVar47 - iVar83);
                                      }
                                      if (iVar83 < iVar47) {
                                        lVar72 = 0;
                                        do {
                                          *(float *)((long)&scanline->data + (iVar83 + lVar72) * 4)
                                               = fVar99 * fVar130 * 0.5 + fVar132 +
                                                 *(float *)((long)&scanline->data +
                                                           (iVar83 + lVar72) * 4);
                                          fVar132 = fVar132 + fVar99 * fVar130;
                                          lVar72 = lVar72 + 1;
                                        } while (~uVar46 + iVar47 != (int)lVar72);
                                      }
                                      lVar72 = (long)iVar47;
                                      *(float *)((long)&scanline->data + lVar72 * 4) =
                                           (((fVar128 + 1.0) - fVar118) +
                                           ((fVar128 + 1.0) - fVar128)) * 0.5 * (fVar115 - fVar117)
                                           * fVar130 + fVar132 +
                                           *(float *)((long)&scanline->data + lVar72 * 4);
                                      fVar130 = (fVar115 - fVar109) * fVar130;
                                    }
                                    local_300[lVar72] = fVar130 + local_300[lVar72];
                                    goto LAB_0020ba7e;
                                  }
                                }
                                if ((uint)local_3b0 < 0x7fffffff) {
                                  uStack_2e4 = 0;
                                  uStack_2e0 = 0;
                                  uStack_2dc = 0;
                                  local_3c8 = ZEXT416((uint)fVar113);
                                  local_328 = fVar99;
                                  uVar46 = 0;
                                  do {
                                    fVar108 = (float)(int)uVar46;
                                    uVar82 = uVar46 + 1;
                                    fVar110 = (float)(int)uVar82;
                                    fVar99 = (fVar108 - local_2e8) / local_328 + fVar103;
                                    fVar109 = (fVar110 - local_2e8) / local_328 + fVar103;
                                    local_490._8_4_ = fVar99;
                                    local_448._0_4_ = fVar108;
                                    fVar113 = local_3c8._0_4_;
                                    if ((fVar108 <= local_2e8) || (fVar113 <= fVar110)) {
                                      if ((fVar108 <= fVar113) || (local_2e8 <= fVar110)) {
                                        fVar115 = local_2e8;
                                        fVar117 = fVar103;
                                        if (((fVar108 <= local_2e8) || (fVar113 <= fVar108)) &&
                                           ((fVar108 <= fVar113 || (local_2e8 <= fVar108)))) {
                                          if (((local_2e8 < fVar110) && (fVar110 < fVar113)) ||
                                             ((fVar108 = local_2e8, fVar99 = fVar103,
                                              fVar113 < fVar110 && (fVar110 < local_2e8)))) {
                                            local_418._0_4_ = fVar109;
                                            fVar99 = local_2e8;
                                            fVar108 = fVar103;
                                            goto LAB_0020b729;
                                          }
                                          goto LAB_0020b7e6;
                                        }
                                      }
                                      else {
                                        local_418._0_4_ = fVar109;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar46,psVar56,local_2e8,
                                                   fVar103,fVar110,fVar109);
                                        fVar115 = fVar110;
                                        fVar99 = (float)local_490._8_4_;
                                        fVar108 = (float)local_448._0_4_;
                                        fVar117 = (float)local_418._0_4_;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar46,psVar56,fVar115,fVar117,
                                                 fVar108,fVar99);
                                      fVar108 = (float)local_448._0_4_;
                                      fVar99 = (float)local_490._8_4_;
                                    }
                                    else {
                                      local_418._0_4_ = fVar109;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar46,psVar56,local_2e8,fVar103,
                                                 fVar108,fVar99);
                                      fVar99 = (float)local_448._0_4_;
                                      fVar109 = (float)local_418._0_4_;
                                      fVar108 = (float)local_490._8_4_;
LAB_0020b729:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar46,psVar56,fVar99,fVar108,
                                                 fVar110,fVar109);
                                      fVar108 = fVar110;
                                      fVar99 = (float)local_418._0_4_;
                                    }
LAB_0020b7e6:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar46,psVar56,fVar108,fVar99,
                                               local_3c8._0_4_,fVar98);
                                    fVar108 = local_2e8;
                                    uVar46 = uVar82;
                                  } while (local_41c != uVar82);
                                }
                              }
                              else if (local_2e8 < local_3cc) {
                                if (0.0 <= local_2e8) {
                                  iVar83 = (int)local_2e8;
                                  uStack_2e4 = 0;
                                  uStack_2e0 = 0;
                                  uStack_2dc = 0;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,iVar83,psVar56,local_2e8,fVar103,
                                             local_2e8,fVar98);
                                  iVar83 = iVar83 + 1;
                                  fVar99 = local_2e8;
                                }
                                else {
                                  iVar83 = 0;
                                  fVar99 = local_2e8;
                                  local_2e8 = fVar108;
                                }
                                stbtt__handle_clipped_edge
                                          (local_350,iVar83,psVar56,fVar99,fVar103,fVar99,fVar98);
                                fVar108 = local_2e8;
                              }
LAB_0020ba7e:
                              local_2e8 = fVar108;
                              iVar83 = local_330;
                              fVar108 = local_2e8;
                            }
                            uVar46 = (uint)DAT_0024bcb0;
                            if ((uint)local_3b0 < 0x7fffffff) {
                              fVar98 = 0.0;
                              psVar55 = scanline;
                              uVar59 = local_360;
                              lVar72 = local_298;
                              do {
                                fVar98 = fVar98 + *(float *)((long)&psVar55->data + local_298 * 4);
                                iVar47 = (int)((float)((uint)(*(float *)&psVar55->data + fVar98) &
                                                      uVar46) * 255.0 + 0.5);
                                uVar71 = (uchar)iVar47;
                                if (0xfe < iVar47) {
                                  uVar71 = 0xff;
                                }
                                local_368[(int)uVar59] = uVar71;
                                uVar59 = (ulong)((int)uVar59 + 1);
                                psVar55 = (stbtt__buf *)((long)&psVar55->data + 4);
                                lVar72 = lVar72 + -1;
                              } while (lVar72 != 0);
                            }
                            if ((stbtt__active_edge *)local_490._0_8_ != (stbtt__active_edge *)0x0)
                            {
                              plVar65 = (long *)local_490;
                              psVar56 = (stbtt__active_edge *)local_490._0_8_;
                              do {
                                psVar56->fx = psVar56->fdx + psVar56->fx;
                                plVar65 = (long *)*plVar65;
                                psVar56 = (stbtt__active_edge *)*plVar65;
                              } while (psVar56 != (stbtt__active_edge *)0x0);
                            }
                            local_330 = iVar83 + 1;
                            iVar47 = (int)local_358;
                            local_358 = (ulong)(iVar47 + 1);
                            local_360 = (ulong)(uint)((int)local_360 + local_46c);
                            puVar57 = local_3b8;
                            psVar78 = local_2d0;
                          } while (iVar47 != (int)local_388);
                        }
                        else {
                          local_3b8 = (undefined8 *)0x0;
                          puVar57 = local_3b8;
                          iVar83 = local_330;
                          psVar78 = psVar54;
                        }
                        while (local_330 = iVar83, psVar54 = local_2d0, local_2d0 = psVar78,
                              puVar57 != (undefined8 *)0x0) {
                          puVar14 = (undefined8 *)*puVar57;
                          ImGui::MemFree(puVar57);
                          puVar57 = puVar14;
                          iVar83 = local_330;
                          psVar78 = local_2d0;
                          local_2d0 = psVar54;
                        }
                        if (scanline != local_268) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(psVar54);
                      }
                      ImGui::MemFree(local_460);
                      ImGui::MemFree(local_370);
                    }
                  }
                }
                ImGui::MemFree((void *)CONCAT44(local_3d8._4_4_,(stbtt_uint32)local_3d8));
                if (1 < (byte)local_3e0) {
                  iVar83 = *(int *)(local_378 + 4);
                  local_268[0].data = (uchar *)0x0;
                  local_490._8_4_ = *(int *)(local_378 + 8);
                  if (0 < *(int *)(local_378 + 8)) {
                    puVar53 = local_380 +
                              *(int *)(local_378 + 0x10) * local_468 +
                              (long)*(int *)(local_378 + 0xc);
                    iVar47 = iVar83 - (int)local_3e0;
                    uVar59 = (ulong)(iVar47 + 1);
                    fVar98 = 0.0;
                    do {
                      uVar75 = local_3e0;
                      __memset_chk(local_268,0,local_3e0);
                      switch((int)uVar75) {
                      case 2:
                        if (iVar47 < 0) {
LAB_0020bf80:
                          uVar73 = 0;
                          uVar75 = 0;
                        }
                        else {
                          uVar73 = 0;
                          uVar75 = 0;
                          do {
                            bVar162 = puVar53[uVar73];
                            bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                            *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 + 2 & 7)) =
                                 bVar162;
                            uVar46 = (int)uVar75 + ((uint)bVar162 - (uint)bVar9);
                            uVar75 = (ulong)uVar46;
                            puVar53[uVar73] = (uchar)(uVar46 >> 1);
                            uVar73 = uVar73 + 1;
                          } while (uVar59 != uVar73);
                        }
                        break;
                      case 3:
                        if (iVar47 < 0) goto LAB_0020bf80;
                        uVar73 = 0;
                        uVar75 = 0;
                        do {
                          bVar162 = puVar53[uVar73];
                          bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                          *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 + 3 & 7)) =
                               bVar162;
                          uVar75 = (ulong)((int)uVar75 + ((uint)bVar162 - (uint)bVar9));
                          puVar53[uVar73] = (uchar)(uVar75 / 3);
                          uVar73 = uVar73 + 1;
                        } while (uVar59 != uVar73);
                        break;
                      case 4:
                        if (iVar47 < 0) goto LAB_0020bf80;
                        uVar73 = 0;
                        uVar75 = 0;
                        do {
                          bVar162 = puVar53[uVar73];
                          uVar66 = (ulong)((uint)uVar73 & 7);
                          bVar9 = *(byte *)((long)&local_268[0].data + uVar66);
                          *(byte *)((long)&local_268[0].data + (uVar66 ^ 4)) = bVar162;
                          uVar46 = (int)uVar75 + ((uint)bVar162 - (uint)bVar9);
                          uVar75 = (ulong)uVar46;
                          puVar53[uVar73] = (uchar)(uVar46 >> 2);
                          uVar73 = uVar73 + 1;
                        } while (uVar59 != uVar73);
                        break;
                      case 5:
                        if (iVar47 < 0) goto LAB_0020bf80;
                        uVar73 = 0;
                        uVar75 = 0;
                        do {
                          bVar162 = puVar53[uVar73];
                          bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                          *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 + 5 & 7)) =
                               bVar162;
                          uVar75 = (ulong)((int)uVar75 + ((uint)bVar162 - (uint)bVar9));
                          puVar53[uVar73] = (uchar)(uVar75 / 5);
                          uVar73 = uVar73 + 1;
                        } while (uVar59 != uVar73);
                        break;
                      default:
                        if (iVar47 < 0) goto LAB_0020bf80;
                        uVar73 = 0;
                        uVar75 = 0;
                        do {
                          bVar162 = puVar53[uVar73];
                          bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                          *(byte *)((long)&local_268[0].data +
                                   (ulong)((int)local_2a0 + (uint)uVar73 & 7)) = bVar162;
                          uVar75 = (ulong)((int)uVar75 + ((uint)bVar162 - (uint)bVar9));
                          puVar53[uVar73] = (uchar)(uVar75 / (local_3e0 & 0xffffffff));
                          uVar73 = uVar73 + 1;
                        } while (uVar59 != uVar73);
                      }
                      if ((int)uVar73 < iVar83) {
                        uVar73 = uVar73 & 0xffffffff;
                        do {
                          uVar75 = (ulong)((int)uVar75 -
                                          (uint)*(byte *)((long)&local_268[0].data +
                                                         (ulong)((uint)uVar73 & 7)));
                          puVar53[uVar73] = (uchar)(uVar75 / (local_3e0 & 0xffffffff));
                          uVar73 = uVar73 + 1;
                        } while ((int)uVar73 < iVar83);
                      }
                      puVar53 = puVar53 + local_468;
                      fVar98 = (float)((int)fVar98 + 1);
                    } while (fVar98 != (float)local_490._8_4_);
                  }
                }
                atlas_00 = pIVar69;
                if (1 < (byte)local_400) {
                  iVar83 = *(int *)(local_378 + 8);
                  local_268[0].data = (uchar *)0x0;
                  local_490._8_4_ = *(int *)(local_378 + 4);
                  if (0 < *(int *)(local_378 + 4)) {
                    pbVar70 = local_380 +
                              *(int *)(local_378 + 0x10) * local_468 +
                              (long)*(int *)(local_378 + 0xc);
                    iVar47 = iVar83 - (int)local_400;
                    uVar59 = (ulong)(iVar47 + 1);
                    fVar98 = 0.0;
                    do {
                      uVar75 = local_400;
                      __memset_chk(local_268,0,local_400);
                      switch((int)uVar75) {
                      case 2:
                        if (iVar47 < 0) {
LAB_0020c211:
                          uVar73 = 0;
                          uVar75 = 0;
                        }
                        else {
                          uVar73 = 0;
                          uVar75 = 0;
                          pbVar74 = pbVar70;
                          do {
                            bVar162 = *pbVar74;
                            bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                            *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 + 2 & 7)) =
                                 bVar162;
                            uVar46 = (int)uVar75 + ((uint)bVar162 - (uint)bVar9);
                            uVar75 = (ulong)uVar46;
                            *pbVar74 = (byte)(uVar46 >> 1);
                            uVar73 = uVar73 + 1;
                            pbVar74 = pbVar74 + local_468;
                          } while (uVar59 != uVar73);
                        }
                        break;
                      case 3:
                        if (iVar47 < 0) goto LAB_0020c211;
                        uVar73 = 0;
                        uVar75 = 0;
                        pbVar74 = pbVar70;
                        do {
                          bVar162 = *pbVar74;
                          bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                          *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 + 3 & 7)) =
                               bVar162;
                          uVar75 = (ulong)((int)uVar75 + ((uint)bVar162 - (uint)bVar9));
                          *pbVar74 = (byte)(uVar75 / 3);
                          uVar73 = uVar73 + 1;
                          pbVar74 = pbVar74 + local_468;
                        } while (uVar59 != uVar73);
                        break;
                      case 4:
                        if (iVar47 < 0) goto LAB_0020c211;
                        uVar73 = 0;
                        uVar75 = 0;
                        pbVar74 = pbVar70;
                        do {
                          bVar162 = *pbVar74;
                          uVar66 = (ulong)((uint)uVar73 & 7);
                          bVar9 = *(byte *)((long)&local_268[0].data + uVar66);
                          *(byte *)((long)&local_268[0].data + (uVar66 ^ 4)) = bVar162;
                          uVar46 = (int)uVar75 + ((uint)bVar162 - (uint)bVar9);
                          uVar75 = (ulong)uVar46;
                          *pbVar74 = (byte)(uVar46 >> 2);
                          uVar73 = uVar73 + 1;
                          pbVar74 = pbVar74 + local_468;
                        } while (uVar59 != uVar73);
                        break;
                      case 5:
                        if (iVar47 < 0) goto LAB_0020c211;
                        uVar73 = 0;
                        uVar75 = 0;
                        pbVar74 = pbVar70;
                        do {
                          bVar162 = *pbVar74;
                          bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                          *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 + 5 & 7)) =
                               bVar162;
                          uVar75 = (ulong)((int)uVar75 + ((uint)bVar162 - (uint)bVar9));
                          *pbVar74 = (byte)(uVar75 / 5);
                          uVar73 = uVar73 + 1;
                          pbVar74 = pbVar74 + local_468;
                        } while (uVar59 != uVar73);
                        break;
                      default:
                        if (iVar47 < 0) goto LAB_0020c211;
                        uVar73 = 0;
                        uVar75 = 0;
                        pbVar74 = pbVar70;
                        do {
                          bVar162 = *pbVar74;
                          bVar9 = *(byte *)((long)&local_268[0].data + (ulong)((uint)uVar73 & 7));
                          *(byte *)((long)&local_268[0].data +
                                   (ulong)((int)local_2a8 + (uint)uVar73 & 7)) = bVar162;
                          uVar75 = (ulong)((int)uVar75 + ((uint)bVar162 - (uint)bVar9));
                          *pbVar74 = (byte)(uVar75 / (local_400 & 0xffffffff));
                          uVar73 = uVar73 + 1;
                          pbVar74 = pbVar74 + local_468;
                        } while (uVar59 != uVar73);
                      }
                      if ((int)uVar73 < iVar83) {
                        lVar72 = (long)(int)uVar73;
                        pbVar74 = pbVar70 + local_468 * lVar72;
                        do {
                          uVar75 = (ulong)((int)uVar75 -
                                          (uint)*(byte *)((long)&local_268[0].data +
                                                         (ulong)((uint)lVar72 & 7)));
                          *pbVar74 = (byte)(uVar75 / (local_400 & 0xffffffff));
                          lVar72 = lVar72 + 1;
                          pbVar74 = pbVar74 + local_468;
                        } while (iVar83 != lVar72);
                      }
                      pbVar70 = pbVar70 + 1;
                      fVar98 = (float)((int)fVar98 + 1);
                      atlas_00 = pIVar69;
                    } while (fVar98 != (float)local_490._8_4_);
                  }
                }
                *local_2b8 = *(undefined2 *)(local_378 + 0xc);
                local_2b8[1] = *(undefined2 *)(local_378 + 0x10);
                local_2b8[2] = (short)*(undefined4 *)(local_378 + 4) +
                               (short)*(undefined4 *)(local_378 + 0xc);
                local_2b8[3] = (short)*(undefined4 *)(local_378 + 8) +
                               (short)*(undefined4 *)(local_378 + 0x10);
                *(float *)(local_2b8 + 8) =
                     (float)(int)(short)((short)(local_338 << 8) + (short)local_33c) * local_2f8;
                auVar100 = ZEXT416((uint)local_3a4);
                *(float *)(local_2b8 + 4) = (float)local_38c * local_340 + local_3a4;
                *(float *)(local_2b8 + 6) = (float)local_390 * local_344 + local_3a0;
                *(float *)(local_2b8 + 10) =
                     (float)(*(int *)(local_378 + 4) + local_38c) * local_340 + local_3a4;
                *(float *)(local_2b8 + 0xc) =
                     (float)(*(int *)(local_378 + 8) + local_390) * local_344 + local_3a0;
                uVar75 = (ulong)local_334;
                lVar72 = local_2c0;
                uVar59 = local_2b0;
                psVar68 = local_310;
                pIVar69 = atlas_00;
                fVar103 = local_340;
                if ((int)local_308 == 0) {
                  uVar75 = local_2b0 & 0xffffffff;
                }
              }
            }
            uVar59 = uVar59 + 1;
            uVar46 = in_stack_fffffffffffffb64;
          } while ((long)uVar59 < (long)psVar68[1].fontstart);
        }
        fVar98 = local_2c8[local_318].RasterizerMultiply;
        if ((fVar98 != 1.0) || (NAN(fVar98))) {
          lVar72 = 0;
          auVar93 = _DAT_0025c6c0;
          auVar101 = _DAT_0025c6b0;
          auVar104 = _DAT_0025c6a0;
          auVar105 = _DAT_0025c690;
          do {
            auVar92 = auVar101 & _DAT_0025c6d0 | _DAT_0025c6e0;
            uVar46 = auVar101._4_4_;
            uVar82 = auVar101._8_4_;
            uVar67 = auVar101._12_4_;
            auVar124 = auVar93 & _DAT_0025c6d0 | _DAT_0025c6e0;
            uVar79 = auVar93._4_4_;
            uVar114 = auVar93._8_4_;
            uVar116 = auVar93._12_4_;
            auVar134 = auVar105 & _DAT_0025c6d0 | _DAT_0025c6e0;
            uVar127 = auVar105._4_4_;
            uVar129 = auVar105._8_4_;
            uVar131 = auVar105._12_4_;
            auVar149 = auVar104 & _DAT_0025c6d0 | _DAT_0025c6e0;
            uVar138 = auVar104._4_4_;
            uVar140 = auVar104._8_4_;
            uVar142 = auVar104._12_4_;
            fVar133 = (((float)(auVar104._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar149._0_4_) * fVar98;
            fVar139 = (((float)(uVar138 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar149._4_4_) *
                      fVar98;
            fVar141 = (((float)(uVar140 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar149._8_4_) *
                      fVar98;
            fVar143 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar149._12_4_) *
                      fVar98;
            fVar118 = (((float)(auVar105._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar134._0_4_) * fVar98;
            fVar128 = (((float)(uVar127 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar134._4_4_) *
                      fVar98;
            fVar130 = (((float)(uVar129 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar134._8_4_) *
                      fVar98;
            fVar132 = (((float)(uVar131 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar134._12_4_) *
                      fVar98;
            fVar110 = (((float)(auVar93._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar124._0_4_
                      ) * fVar98;
            fVar113 = (((float)(uVar79 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar124._4_4_) *
                      fVar98;
            fVar115 = (((float)(uVar114 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar124._8_4_) *
                      fVar98;
            fVar117 = (((float)(uVar116 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar124._12_4_) *
                      fVar98;
            fVar103 = (((float)(auVar101._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar92._0_4_
                      ) * fVar98;
            fVar99 = (((float)(uVar46 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar92._4_4_) *
                     fVar98;
            fVar108 = (((float)(uVar82 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar92._8_4_) *
                      fVar98;
            fVar109 = (((float)(uVar67 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar92._12_4_) *
                      fVar98;
            auVar107._0_4_ = (int)fVar103;
            auVar107._4_4_ = (int)fVar99;
            auVar107._8_4_ = (int)fVar108;
            auVar107._12_4_ = (int)fVar109;
            auVar155._0_4_ = auVar107._0_4_ >> 0x1f;
            auVar155._4_4_ = auVar107._4_4_ >> 0x1f;
            auVar155._8_4_ = auVar107._8_4_ >> 0x1f;
            auVar155._12_4_ = auVar107._12_4_ >> 0x1f;
            auVar106._0_4_ = (int)(fVar103 - 2.1474836e+09);
            auVar106._4_4_ = (int)(fVar99 - 2.1474836e+09);
            auVar106._8_4_ = (int)(fVar108 - 2.1474836e+09);
            auVar106._12_4_ = (int)(fVar109 - 2.1474836e+09);
            auVar107 = auVar106 & auVar155 | auVar107;
            auVar112._0_4_ = (int)fVar110;
            auVar112._4_4_ = (int)fVar113;
            auVar112._8_4_ = (int)fVar115;
            auVar112._12_4_ = (int)fVar117;
            auVar156._0_4_ = auVar112._0_4_ >> 0x1f;
            auVar156._4_4_ = auVar112._4_4_ >> 0x1f;
            auVar156._8_4_ = auVar112._8_4_ >> 0x1f;
            auVar156._12_4_ = auVar112._12_4_ >> 0x1f;
            auVar111._0_4_ = (int)(fVar110 - 2.1474836e+09);
            auVar111._4_4_ = (int)(fVar113 - 2.1474836e+09);
            auVar111._8_4_ = (int)(fVar115 - 2.1474836e+09);
            auVar111._12_4_ = (int)(fVar117 - 2.1474836e+09);
            auVar112 = auVar111 & auVar156 | auVar112;
            auVar151._0_4_ = (int)fVar118;
            auVar151._4_4_ = (int)fVar128;
            auVar151._8_4_ = (int)fVar130;
            auVar151._12_4_ = (int)fVar132;
            auVar159._0_4_ = auVar151._0_4_ >> 0x1f;
            auVar159._4_4_ = auVar151._4_4_ >> 0x1f;
            auVar159._8_4_ = auVar151._8_4_ >> 0x1f;
            auVar159._12_4_ = auVar151._12_4_ >> 0x1f;
            auVar150._0_4_ = (int)(fVar118 - 2.1474836e+09);
            auVar150._4_4_ = (int)(fVar128 - 2.1474836e+09);
            auVar150._8_4_ = (int)(fVar130 - 2.1474836e+09);
            auVar150._12_4_ = (int)(fVar132 - 2.1474836e+09);
            auVar151 = auVar150 & auVar159 | auVar151;
            auVar136._0_4_ = (int)fVar133;
            auVar136._4_4_ = (int)fVar139;
            auVar136._8_4_ = (int)fVar141;
            auVar136._12_4_ = (int)fVar143;
            auVar157._0_4_ = auVar136._0_4_ >> 0x1f;
            auVar157._4_4_ = auVar136._4_4_ >> 0x1f;
            auVar157._8_4_ = auVar136._8_4_ >> 0x1f;
            auVar157._12_4_ = auVar136._12_4_ >> 0x1f;
            auVar135._0_4_ = (int)(fVar133 - 2.1474836e+09);
            auVar135._4_4_ = (int)(fVar139 - 2.1474836e+09);
            auVar135._8_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar135._12_4_ = (int)(fVar143 - 2.1474836e+09);
            auVar136 = auVar135 & auVar157 | auVar136;
            auVar92 = auVar136 ^ _DAT_0024bca0;
            auVar125._0_4_ = -(uint)(auVar92._0_4_ < -0x7fffff01);
            auVar125._4_4_ = -(uint)(auVar92._4_4_ < -0x7fffff01);
            auVar125._8_4_ = -(uint)(auVar92._8_4_ < -0x7fffff01);
            auVar125._12_4_ = -(uint)(auVar92._12_4_ < -0x7fffff01);
            auVar92 = ~auVar125 & _DAT_0025c730 | auVar136 & auVar125;
            auVar124 = auVar151 ^ _DAT_0024bca0;
            auVar158._0_4_ = -(uint)(auVar124._0_4_ < -0x7fffff01);
            auVar158._4_4_ = -(uint)(auVar124._4_4_ < -0x7fffff01);
            auVar158._8_4_ = -(uint)(auVar124._8_4_ < -0x7fffff01);
            auVar158._12_4_ = -(uint)(auVar124._12_4_ < -0x7fffff01);
            auVar124 = ~auVar158 & _DAT_0025c730 | auVar151 & auVar158;
            sVar32 = auVar92._0_2_;
            cVar16 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[0] - (0xff < sVar32);
            sVar32 = auVar92._2_2_;
            sVar39 = CONCAT11((0 < sVar32) * (sVar32 < 0x100) * auVar92[2] - (0xff < sVar32),cVar16)
            ;
            sVar32 = auVar92._4_2_;
            cVar17 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[4] - (0xff < sVar32);
            sVar32 = auVar92._6_2_;
            uVar119 = CONCAT13((0 < sVar32) * (sVar32 < 0x100) * auVar92[6] - (0xff < sVar32),
                               CONCAT12(cVar17,sVar39));
            sVar32 = auVar92._8_2_;
            cVar18 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[8] - (0xff < sVar32);
            sVar32 = auVar92._10_2_;
            uVar120 = CONCAT15((0 < sVar32) * (sVar32 < 0x100) * auVar92[10] - (0xff < sVar32),
                               CONCAT14(cVar18,uVar119));
            sVar32 = auVar92._12_2_;
            cVar19 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[0xc] - (0xff < sVar32);
            sVar32 = auVar92._14_2_;
            uVar121 = CONCAT17((0 < sVar32) * (sVar32 < 0x100) * auVar92[0xe] - (0xff < sVar32),
                               CONCAT16(cVar19,uVar120));
            sVar32 = auVar124._0_2_;
            cVar20 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[0] - (0xff < sVar32);
            sVar32 = auVar124._2_2_;
            auVar122._0_10_ =
                 CONCAT19((0 < sVar32) * (sVar32 < 0x100) * auVar124[2] - (0xff < sVar32),
                          CONCAT18(cVar20,uVar121));
            sVar32 = auVar124._4_2_;
            cVar21 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[4] - (0xff < sVar32);
            auVar122[10] = cVar21;
            sVar32 = auVar124._6_2_;
            auVar122[0xb] = (0 < sVar32) * (sVar32 < 0x100) * auVar124[6] - (0xff < sVar32);
            sVar32 = auVar124._8_2_;
            cVar22 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[8] - (0xff < sVar32);
            auVar123[0xc] = cVar22;
            auVar123._0_12_ = auVar122;
            sVar32 = auVar124._10_2_;
            auVar123[0xd] = (0 < sVar32) * (sVar32 < 0x100) * auVar124[10] - (0xff < sVar32);
            sVar32 = auVar124._12_2_;
            cVar23 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[0xc] - (0xff < sVar32);
            auVar126[0xe] = cVar23;
            auVar126._0_14_ = auVar123;
            sVar32 = auVar124._14_2_;
            auVar126[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar124[0xe] - (0xff < sVar32);
            auVar92 = auVar112 ^ _DAT_0024bca0;
            auVar152._0_4_ = -(uint)(auVar92._0_4_ < -0x7fffff01);
            auVar152._4_4_ = -(uint)(auVar92._4_4_ < -0x7fffff01);
            auVar152._8_4_ = -(uint)(auVar92._8_4_ < -0x7fffff01);
            auVar152._12_4_ = -(uint)(auVar92._12_4_ < -0x7fffff01);
            auVar124 = ~auVar152 & _DAT_0025c730 | auVar112 & auVar152;
            auVar92 = auVar107 ^ _DAT_0024bca0;
            auVar137._0_4_ = -(uint)(auVar92._0_4_ < -0x7fffff01);
            auVar137._4_4_ = -(uint)(auVar92._4_4_ < -0x7fffff01);
            auVar137._8_4_ = -(uint)(auVar92._8_4_ < -0x7fffff01);
            auVar137._12_4_ = -(uint)(auVar92._12_4_ < -0x7fffff01);
            auVar92 = ~auVar137 & _DAT_0025c730 | auVar107 & auVar137;
            sVar32 = auVar124._0_2_;
            cVar24 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[0] - (0xff < sVar32);
            sVar32 = auVar124._2_2_;
            sVar90 = CONCAT11((0 < sVar32) * (sVar32 < 0x100) * auVar124[2] - (0xff < sVar32),cVar24
                             );
            sVar32 = auVar124._4_2_;
            cVar25 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[4] - (0xff < sVar32);
            sVar32 = auVar124._6_2_;
            uVar144 = CONCAT13((0 < sVar32) * (sVar32 < 0x100) * auVar124[6] - (0xff < sVar32),
                               CONCAT12(cVar25,sVar90));
            sVar32 = auVar124._8_2_;
            cVar26 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[8] - (0xff < sVar32);
            sVar32 = auVar124._10_2_;
            uVar145 = CONCAT15((0 < sVar32) * (sVar32 < 0x100) * auVar124[10] - (0xff < sVar32),
                               CONCAT14(cVar26,uVar144));
            sVar32 = auVar124._12_2_;
            cVar27 = (0 < sVar32) * (sVar32 < 0x100) * auVar124[0xc] - (0xff < sVar32);
            sVar32 = auVar124._14_2_;
            uVar146 = CONCAT17((0 < sVar32) * (sVar32 < 0x100) * auVar124[0xe] - (0xff < sVar32),
                               CONCAT16(cVar27,uVar145));
            sVar32 = auVar92._0_2_;
            cVar28 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[0] - (0xff < sVar32);
            sVar32 = auVar92._2_2_;
            auVar147._0_10_ =
                 CONCAT19((0 < sVar32) * (sVar32 < 0x100) * auVar92[2] - (0xff < sVar32),
                          CONCAT18(cVar28,uVar146));
            sVar32 = auVar92._4_2_;
            cVar29 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[4] - (0xff < sVar32);
            auVar147[10] = cVar29;
            sVar32 = auVar92._6_2_;
            auVar147[0xb] = (0 < sVar32) * (sVar32 < 0x100) * auVar92[6] - (0xff < sVar32);
            sVar32 = auVar92._8_2_;
            cVar30 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[8] - (0xff < sVar32);
            auVar148[0xc] = cVar30;
            auVar148._0_12_ = auVar147;
            sVar32 = auVar92._10_2_;
            auVar148[0xd] = (0 < sVar32) * (sVar32 < 0x100) * auVar92[10] - (0xff < sVar32);
            sVar32 = auVar92._12_2_;
            cVar31 = (0 < sVar32) * (sVar32 < 0x100) * auVar92[0xc] - (0xff < sVar32);
            auVar153[0xe] = cVar31;
            auVar153._0_14_ = auVar148;
            sVar32 = auVar92._14_2_;
            auVar153[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar92[0xe] - (0xff < sVar32);
            sVar32 = (short)((uint)uVar144 >> 0x10);
            auVar154[1] = (0 < sVar32) * (sVar32 < 0x100) * cVar25 - (0xff < sVar32);
            auVar154[0] = (0 < sVar90) * (sVar90 < 0x100) * cVar24 - (0xff < sVar90);
            sVar32 = (short)((uint6)uVar145 >> 0x20);
            auVar154[2] = (0 < sVar32) * (sVar32 < 0x100) * cVar26 - (0xff < sVar32);
            sVar32 = (short)((ulong)uVar146 >> 0x30);
            auVar154[3] = (0 < sVar32) * (sVar32 < 0x100) * cVar27 - (0xff < sVar32);
            sVar32 = (short)((unkuint10)auVar147._0_10_ >> 0x40);
            auVar154[4] = (0 < sVar32) * (sVar32 < 0x100) * cVar28 - (0xff < sVar32);
            sVar32 = auVar147._10_2_;
            auVar154[5] = (0 < sVar32) * (sVar32 < 0x100) * cVar29 - (0xff < sVar32);
            sVar32 = auVar148._12_2_;
            auVar154[6] = (0 < sVar32) * (sVar32 < 0x100) * cVar30 - (0xff < sVar32);
            sVar32 = auVar153._14_2_;
            auVar154[7] = (0 < sVar32) * (sVar32 < 0x100) * cVar31 - (0xff < sVar32);
            auVar154[8] = (0 < sVar39) * (sVar39 < 0x100) * cVar16 - (0xff < sVar39);
            sVar32 = (short)((uint)uVar119 >> 0x10);
            auVar154[9] = (0 < sVar32) * (sVar32 < 0x100) * cVar17 - (0xff < sVar32);
            sVar32 = (short)((uint6)uVar120 >> 0x20);
            auVar154[10] = (0 < sVar32) * (sVar32 < 0x100) * cVar18 - (0xff < sVar32);
            sVar32 = (short)((ulong)uVar121 >> 0x30);
            auVar154[0xb] = (0 < sVar32) * (sVar32 < 0x100) * cVar19 - (0xff < sVar32);
            sVar32 = (short)((unkuint10)auVar122._0_10_ >> 0x40);
            auVar154[0xc] = (0 < sVar32) * (sVar32 < 0x100) * cVar20 - (0xff < sVar32);
            sVar32 = auVar122._10_2_;
            auVar154[0xd] = (0 < sVar32) * (sVar32 < 0x100) * cVar21 - (0xff < sVar32);
            sVar32 = auVar123._12_2_;
            auVar154[0xe] = (0 < sVar32) * (sVar32 < 0x100) * cVar22 - (0xff < sVar32);
            sVar32 = auVar126._14_2_;
            auVar154[0xf] = (0 < sVar32) * (sVar32 < 0x100) * cVar23 - (0xff < sVar32);
            *(undefined1 (*) [16])((long)&local_268[0].data + lVar72) = auVar154;
            lVar72 = lVar72 + 0x10;
            iVar83 = (int)DAT_0025c740;
            auVar93._0_4_ = auVar93._0_4_ + iVar83;
            iVar47 = DAT_0025c740._4_4_;
            auVar93._4_4_ = uVar79 + iVar47;
            iVar77 = DAT_0025c740._8_4_;
            auVar93._8_4_ = uVar114 + iVar77;
            iVar58 = DAT_0025c740._12_4_;
            auVar93._12_4_ = uVar116 + iVar58;
            auVar101._0_4_ = auVar101._0_4_ + iVar83;
            auVar101._4_4_ = uVar46 + iVar47;
            auVar101._8_4_ = uVar82 + iVar77;
            auVar101._12_4_ = uVar67 + iVar58;
            auVar104._0_4_ = auVar104._0_4_ + iVar83;
            auVar104._4_4_ = uVar138 + iVar47;
            auVar104._8_4_ = uVar140 + iVar77;
            auVar104._12_4_ = uVar142 + iVar58;
            auVar105._0_4_ = auVar105._0_4_ + iVar83;
            auVar105._4_4_ = uVar127 + iVar47;
            auVar105._8_4_ = uVar129 + iVar77;
            auVar105._12_4_ = uVar131 + iVar58;
          } while (lVar72 != 0x100);
          if (0 < psVar68[1].cff.cursor) {
            lVar49._0_4_ = psVar68[1].hmtx;
            lVar49._4_4_ = psVar68[1].kern;
            iVar83 = 0;
            do {
              if ((*(int *)(lVar49 + 0x14) != 0) && (0 < *(int *)(lVar49 + 8))) {
                iVar47 = *(int *)(lVar49 + 4);
                iVar77 = atlas_00->TexWidth;
                pbVar70 = atlas_00->TexPixelsAlpha8 +
                          (long)*(int *)(lVar49 + 0x10) * (long)iVar77 +
                          (long)*(int *)(lVar49 + 0xc);
                iVar58 = *(int *)(lVar49 + 8);
                do {
                  iVar76 = iVar47 + 1;
                  if (0 < iVar47) {
                    do {
                      *pbVar70 = *(byte *)((long)&local_268[0].data + (ulong)*pbVar70);
                      pbVar70 = pbVar70 + 1;
                      iVar76 = iVar76 + -1;
                    } while (1 < iVar76);
                  }
                  pbVar70 = pbVar70 + ((long)iVar77 - (long)iVar47);
                  bVar85 = 1 < iVar58;
                  iVar58 = iVar58 + -1;
                } while (bVar85);
              }
              iVar83 = iVar83 + 1;
              lVar49 = lVar49 + 0x18;
            } while (iVar83 < psVar68[1].cff.cursor);
          }
        }
        psVar68[1].hmtx = 0;
        psVar68[1].kern = 0;
      }
      lVar72 = local_318 + 1;
    } while (lVar72 < iVar12);
  }
  ImGui::MemFree(local_3e8);
  ImGui::MemFree(local_320);
  uVar121 = local_458._8_8_;
  if ((void *)local_458._8_8_ != (void *)0x0) {
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_458._8_8_;
    local_458 = auVar35 << 0x40;
    ImGui::MemFree((void *)uVar121);
    local_458._8_8_ = 0;
  }
  if (0 < iVar12) {
    lVar72 = 0;
    auVar89._0_12_ = DAT_0025c750._0_12_;
    auVar89._12_2_ = DAT_0025c750._6_2_;
    auVar89._14_2_ = DAT_0025c750._6_2_;
    auVar88._12_4_ = auVar89._12_4_;
    auVar88._0_10_ = (unkbyte10)DAT_0025c750;
    auVar88._10_2_ = DAT_0025c750._4_2_;
    auVar87._10_6_ = auVar88._10_6_;
    auVar87._0_8_ = (undefined8)DAT_0025c750;
    auVar87._8_2_ = DAT_0025c750._4_2_;
    local_418._8_8_ = auVar87._8_8_;
    local_418._6_2_ = DAT_0025c750._2_2_;
    local_418._4_2_ = DAT_0025c750._2_2_;
    local_418._0_2_ = (undefined2)DAT_0025c750;
    local_418._2_2_ = local_418._0_2_;
    do {
      auVar92 = local_448;
      lVar49 = lVar72 * 0x110;
      if (*(int *)((long)pvStack_4b0 + lVar49 + 0xe8) != 0) {
        pIVar15 = (pIVar69->ConfigData).Data;
        pIVar84 = pIVar15 + lVar72;
        this = pIVar15[lVar72].DstFont;
        if (pIVar15[lVar72].MergeMode == false) {
          register0x00001200 = ZEXT416((uint)pIVar15[lVar72].SizePixels);
          lVar50 = *(long *)((long)pvStack_4b0 + lVar49 + 8);
          lVar62 = (long)*(int *)((long)pvStack_4b0 + lVar49 + 0x24);
          local_448._1_3_ = 0;
          local_448[0] = *(byte *)(lVar50 + 4 + lVar62);
          local_448._4_12_ = auVar92._4_12_;
          bVar162 = *(byte *)(lVar50 + 5 + lVar62);
          bVar9 = *(byte *)(lVar50 + 7 + lVar62);
          bVar10 = *(byte *)(lVar50 + 6 + lVar62);
          ImFont::ClearOutputData(this);
          iVar83 = (uint)bVar10 * 0x100 + local_448._0_4_;
          auVar34._1_9_ = (unkuint9)(byte)((uint)iVar83 >> 0x18) << 8;
          auVar34[0] = (char)((uint)iVar83 >> 0x10);
          auVar34._10_6_ = 0;
          auVar36._1_12_ = SUB1612(auVar34 << 0x28,4);
          auVar36[0] = (char)((uint)iVar83 >> 8);
          auVar36[0xd] = 0;
          auVar37._1_14_ = auVar36 << 8;
          auVar37[0] = (char)iVar83;
          auVar37[0xf] = 0;
          auVar92 = ZEXT416((uint)bVar162 | (uint)bVar9 << 0x10) | auVar37 << 8;
          sVar39 = auVar92._0_2_;
          sVar32 = auVar92._2_2_;
          auVar94._0_4_ = (float)((int)sVar39 - (int)sVar32);
          sVar91 = auVar92._6_2_;
          auVar97._0_14_ = ZEXT414((uint)auVar94._0_4_);
          auVar97._14_2_ = sVar91;
          sVar90 = auVar92._4_2_;
          auVar96._12_4_ = auVar97._12_4_;
          auVar96._4_6_ = 0;
          auVar96._0_4_ = auVar94._0_4_;
          auVar96._10_2_ = sVar90;
          auVar95._10_6_ = auVar96._10_6_;
          auVar95._4_6_ = 0;
          auVar95._0_4_ = auVar94._0_4_;
          auVar94._8_8_ = auVar95._8_8_;
          auVar94._6_2_ = sVar32;
          auVar94._4_2_ = (short)((uint)auVar94._0_4_ >> 0x10);
          auVar102._0_2_ = -(ushort)(sVar39 < (short)local_418._0_2_);
          auVar102._2_2_ = -(ushort)(sVar39 < (short)local_418._2_2_);
          auVar102._4_2_ = -(ushort)(sVar32 < (short)local_418._4_2_);
          auVar102._6_2_ = -(ushort)(sVar32 < (short)local_418._6_2_);
          auVar102._8_2_ = -(ushort)(sVar90 < (short)local_418._8_2_);
          auVar102._10_2_ = -(ushort)(sVar90 < (short)local_418._10_2_);
          auVar102._12_2_ = -(ushort)(sVar91 < (short)local_418._12_2_);
          auVar102._14_2_ = -(ushort)(sVar91 < (short)local_418._14_2_);
          auVar92 = auVar102 & _DAT_00257110 | ~auVar102 & _DAT_0024bd00;
          this->FontSize = pIVar84->SizePixels;
          this->ConfigData = pIVar84;
          this->ConfigDataCount = 0;
          this->ContainerAtlas = pIVar69;
          this->Ascent = (float)(int)(((float)local_490._8_4_ / auVar94._0_4_) * (float)(int)sVar39
                                     + auVar92._0_4_);
          this->Descent =
               (float)(int)(((float)local_490._8_4_ / auVar94._0_4_) *
                            (float)(auVar94._4_4_ >> 0x10) + auVar92._4_4_);
        }
        this->ConfigDataCount = this->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvStack_4b0 + lVar49 + 0xe8)) {
          local_490._8_4_ = (pIVar84->GlyphOffset).x;
          local_448 = ZEXT416((uint)((float)(int)(this->Ascent + 0.5) + (pIVar84->GlyphOffset).y));
          lVar62 = 0;
          lVar50 = 0;
          do {
            lVar13 = *(long *)((long)pvStack_4b0 + lVar49 + 0xd0);
            fVar103 = 1.0 / (float)pIVar69->TexHeight;
            fVar98 = 1.0 / (float)pIVar69->TexWidth;
            ImFont::AddGlyph(this,pIVar84,
                             *(ImWchar *)
                              (*(long *)((long)pvStack_4b0 + lVar49 + 0x108) + lVar50 * 4),
                             *(float *)(lVar13 + 8 + lVar62) + 0.0 + (float)local_490._8_4_,
                             *(float *)(lVar13 + 0xc + lVar62) + 0.0 + local_448._0_4_,
                             *(float *)(lVar13 + 0x14 + lVar62) + 0.0 + (float)local_490._8_4_,
                             *(float *)(lVar13 + 0x18 + lVar62) + 0.0 + local_448._0_4_,
                             (float)*(ushort *)(lVar13 + lVar62) * fVar98,
                             (float)*(ushort *)(lVar13 + 2 + lVar62) * fVar103,
                             (float)*(ushort *)(lVar13 + 4 + lVar62) * fVar98,
                             (float)*(ushort *)(lVar13 + 6 + lVar62) * fVar103,
                             *(float *)(lVar13 + 0x10 + lVar62));
            lVar50 = lVar50 + 1;
            lVar62 = lVar62 + 0x1c;
          } while (lVar50 < *(int *)((long)pvStack_4b0 + lVar49 + 0xe8));
        }
      }
      lVar72 = lVar72 + 1;
    } while (lVar72 < iVar12);
    if (0 < iVar12) {
      lVar72 = 0x108;
      lVar49 = 0;
      do {
        if (*(void **)((long)pvStack_4b0 + lVar72) != (void *)0x0) {
          ImGui::MemFree(*(void **)((long)pvStack_4b0 + lVar72));
        }
        pvVar48 = *(void **)((long)pvStack_4b0 + lVar72 + -0x10);
        if (pvVar48 != (void *)0x0) {
          ImGui::MemFree(pvVar48);
        }
        lVar49 = lVar49 + 1;
        lVar72 = lVar72 + 0x110;
      } while (lVar49 < iVar12);
    }
  }
  if (pvStack_4b0 != (void *)0x0) {
    ImGui::MemFree(pvStack_4b0);
    pvStack_4b0 = (void *)0x0;
  }
  ImFontAtlasBuildFinish(pIVar69);
  if (pvStack_3f0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3f0);
  }
  if ((void *)local_458._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_458._8_8_);
  }
LAB_0020ca7b:
  bVar162 = (byte)((uint)uVar161 >> 0x18);
  if (pvStack_430 != (void *)0x0) {
    ImGui::MemFree(pvStack_430);
  }
  if (pvStack_4b0 != (void *)0x0) {
    ImGui::MemFree(pvStack_4b0);
  }
  return (bool)(bVar162 & 1);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}